

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

bool __thiscall ImFontAtlas::Build(ImFontAtlas *this)

{
  ImBitVector *this_00;
  stbtt__edge *psVar1;
  undefined4 uVar2;
  ImVec2 IVar3;
  stbtt__point sVar4;
  undefined4 uVar6;
  undefined8 uVar5;
  stbtt_uint8 sVar7;
  byte bVar8;
  byte bVar9;
  ImWchar IVar10;
  ushort uVar11;
  ImFont *pIVar12;
  ImFont **ppIVar13;
  stbtt_uint8 *data;
  void *pvVar14;
  ImFontConfig *pIVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  stbrp_node *psVar22;
  undefined1 auVar23 [32];
  stbtt__buf fontdict;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  stbtt__point *psVar27;
  size_t sVar28;
  bool bVar29;
  ushort uVar30;
  stbtt_uint32 sVar31;
  stbtt_uint32 sVar36;
  uint uVar37;
  int iVar38;
  int iVar39;
  ulong uVar40;
  stbtt_uint32 sVar32;
  stbtt_uint32 sVar33;
  stbtt_uint32 sVar34;
  stbtt_uint32 sVar35;
  int *piVar41;
  void *pvVar42;
  void *pvVar43;
  stbrp_context *ptr;
  uchar *puVar44;
  stbtt__point *points;
  stbtt__edge *p;
  stbtt__buf *scanline;
  stbtt__buf *psVar45;
  undefined1 auVar46 [8];
  stbtt__active_edge *psVar47;
  int iVar48;
  ulong uVar49;
  ImWchar *pIVar50;
  long lVar51;
  uint *puVar52;
  stbtt__active_edge *psVar53;
  char *__function;
  undefined4 uVar54;
  long lVar55;
  uint *extraout_RDX;
  ulong uVar56;
  uint uVar57;
  uint uVar58;
  size_t sVar59;
  byte *pbVar60;
  ushort *puVar61;
  uchar uVar62;
  ulong uVar63;
  long lVar64;
  size_t size;
  byte *pbVar65;
  ImFontConfig *pIVar66;
  int iVar67;
  int iVar68;
  long lVar69;
  uint uVar70;
  stbtt_fontinfo *psVar71;
  stbtt__active_edge *psVar72;
  ImFontAtlas *pIVar73;
  bool bVar74;
  float fVar75;
  float fVar87;
  float fVar88;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar76;
  float fVar89;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar104;
  float fVar105;
  float fVar109;
  float fVar110;
  undefined1 auVar106 [16];
  float fVar111;
  undefined1 auVar107 [32];
  float fVar112;
  undefined1 auVar108 [32];
  float fVar113;
  float fVar116;
  float fVar117;
  undefined1 auVar114 [16];
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar115 [32];
  float fVar123;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar132;
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  float fVar138;
  float fVar142;
  undefined1 auVar135 [32];
  float fVar136;
  float fVar137;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 in_ZMM8 [64];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  stbtt__buf sVar153;
  undefined1 in_stack_fffffffffffffb00 [12];
  uint uStack_4f0;
  bool bStack_4e1;
  void *__s;
  uint uVar154;
  int iVar155;
  stbtt_uint32 sStack_4bc;
  ImFontAtlas *pIStack_4b8;
  undefined1 auStack_4b0 [8];
  undefined1 auStack_4a8 [16];
  undefined4 uStack_498;
  undefined2 uStack_494;
  undefined2 uStack_492;
  undefined2 uStack_490;
  undefined2 uStack_48e;
  undefined2 uStack_48c;
  undefined2 uStack_48a;
  undefined1 auStack_488 [16];
  ulong uStack_470;
  undefined1 auStack_468 [16];
  void *pvStack_450;
  undefined1 auStack_448 [16];
  undefined8 uStack_438;
  void *pvStack_430;
  stbrp_node *psStack_420;
  ulong uStack_418;
  void *pvStack_410;
  undefined8 uStack_408;
  float fStack_400;
  uint uStack_3fc;
  stbtt__active_edge *psStack_3f8;
  stbtt__edge *psStack_3f0;
  uint *puStack_3e8;
  int iStack_3dc;
  float fStack_3d8;
  uint uStack_3d4;
  long lStack_3d0;
  ulong uStack_3c8;
  uchar *puStack_3c0;
  long lStack_3b8;
  uchar *puStack_3b0;
  stbtt__active_edge *psStack_3a8;
  ulong uStack_3a0;
  float *pfStack_398;
  size_t sStack_390;
  uint uStack_388;
  uint uStack_384;
  int iStack_380;
  int iStack_37c;
  float fStack_378;
  int iStack_374;
  uint uStack_370;
  int iStack_36c;
  undefined1 auStack_368 [16];
  stbrp_context *psStack_358;
  stbtt_fontinfo *psStack_350;
  stbtt__point *psStack_348;
  float *pfStack_340;
  ulong uStack_338;
  ulong uStack_330;
  float fStack_328;
  uint uStack_324;
  uint uStack_320;
  uint uStack_31c;
  undefined1 auStack_318 [16];
  size_t sStack_300;
  ImFontConfig *pIStack_2f8;
  long lStack_2f0;
  uint *puStack_2e8;
  long lStack_2e0;
  long lStack_2d8;
  size_t sStack_2d0;
  size_t sStack_2c8;
  int iStack_2c0;
  int iStack_2bc;
  undefined1 auStack_2b8 [16];
  undefined1 auStack_2a8 [16];
  stbtt__buf asStack_298 [33];
  undefined2 uStack_88;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  undefined2 uStack_80;
  undefined2 uStack_7e;
  undefined2 uStack_7c;
  undefined2 uStack_7a;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined2 uStack_68;
  undefined2 uStack_66;
  undefined2 uStack_64;
  undefined2 uStack_62;
  undefined2 uStack_60;
  undefined2 uStack_5e;
  undefined2 uStack_5c;
  undefined2 uStack_5a;
  undefined1 auStack_58 [16];
  undefined1 auStack_48 [16];
  
  auStack_448._8_8_ = auStack_448._0_8_;
  if (this->Locked == true) {
    __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x817,"bool ImFontAtlas::Build()");
  }
  if (this->FontBuilderIO != (ImFontBuilderIO *)0x0) {
    bVar29 = (*this->FontBuilderIO->FontBuilder_Build)(this);
    return bVar29;
  }
  ImFontAtlasGetBuilderForStbTruetype::io.FontBuilder_Build = ImFontAtlasBuildWithStbTruetype;
  if ((this->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x867,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  ImFontAtlasBuildInit(this);
  this->TexID = (ImTextureID)0x0;
  this->TexWidth = 0;
  this->TexHeight = 0;
  (this->TexUvScale).x = 0.0;
  (this->TexUvScale).y = 0.0;
  __s = (void *)0x0;
  (this->TexUvWhitePixel).x = 0.0;
  (this->TexUvWhitePixel).y = 0.0;
  ClearTexData(this);
  uVar37 = (this->ConfigData).Size;
  iVar155 = (int)uVar37 >> 0x1f;
  if (0 < (int)uVar37) {
    uVar40 = 8;
    if (8 < (int)uVar37) {
      uVar40 = (ulong)uVar37;
    }
    __s = ImGui::MemAlloc(uVar40 * 0x110);
  }
  uVar70 = (this->Fonts).Size;
  lVar69 = (long)(int)uVar70;
  if (lVar69 < 1) {
    pvStack_450 = (void *)0x0;
  }
  else {
    uVar40 = 8;
    if (8 < (int)uVar70) {
      uVar40 = (ulong)uVar70;
    }
    pvStack_450 = ImGui::MemAlloc(uVar40 << 5);
  }
  sStack_300 = CONCAT44(iVar155,uVar37) * 0x110;
  uVar154 = uVar37;
  memset(__s,0,sStack_300);
  sStack_390 = lVar69 << 5;
  memset(pvStack_450,0,sStack_390);
  uVar70 = (this->ConfigData).Size;
  uVar40 = (ulong)uVar70;
  bStack_4e1 = (int)uVar70 < 1;
  auStack_448._0_8_ = lVar69;
  pIStack_4b8 = this;
  if (0 < (int)uVar70) {
    uVar49 = 0;
    if (0 < (int)uVar37) {
      uVar49 = (ulong)uVar37;
    }
    auStack_368._0_8_ = uVar49;
    lVar64 = 0;
    pvVar43 = __s;
    do {
      fVar93 = (float)CONCAT22(uStack_498._2_2_,(undefined2)uStack_498);
      if (lVar64 == auStack_368._0_8_) {
        __function = "T &ImVector<ImFontBuildSrcData>::operator[](int) [T = ImFontBuildSrcData]";
        goto LAB_00190de1;
      }
      if ((int)uVar40 <= lVar64) goto LAB_00190e4b;
      pIVar66 = (pIStack_4b8->ConfigData).Data;
      pIVar12 = pIVar66[lVar64].DstFont;
      if ((pIVar12 == (ImFont *)0x0) ||
         (pIVar12->ContainerAtlas != pIStack_4b8 && pIVar12->ContainerAtlas != (ImFontAtlas *)0x0))
      {
        __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                      ,0x87f,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(undefined4 *)((long)pvVar43 + lVar64 * 0x110 + 0xe0) = 0xffffffff;
      uVar40 = (ulong)(pIStack_4b8->Fonts).Size;
      if ((long)uVar40 < 1) {
LAB_00190e9e:
        __assert_fail("src_tmp.DstIndex != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                      ,0x888,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      pIVar66 = pIVar66 + lVar64;
      ppIVar13 = (pIStack_4b8->Fonts).Data;
      uVar63 = 0xffffffff;
      uVar49 = 0;
      do {
        if (pIVar12 == ppIVar13[uVar49]) {
          *(int *)((long)pvVar43 + lVar64 * 0x110 + 0xe0) = (int)uVar49;
          uVar63 = uVar49 & 0xffffffff;
        }
        uVar49 = uVar49 + 1;
      } while ((uVar49 < uVar40) && ((int)uVar63 == -1));
      if ((int)uVar63 == -1) goto LAB_00190e9e;
      data = (stbtt_uint8 *)pIVar66->FontData;
      iVar38 = pIVar66->FontNo;
      sVar7 = *data;
      if (((((sVar7 == '1') && (data[1] == '\0')) && (data[2] == '\0')) && (data[3] == '\0')) ||
         (((sVar7 == 't' && (data[1] == 'y')) && ((data[2] == 'p' && (data[3] == '1')))))) {
LAB_0018dd1f:
        sVar36 = -(uint)(iVar38 != 0);
      }
      else {
        if (sVar7 == '\0') {
          if (((data[1] != '\x01') || (data[2] != '\0')) || (data[3] != '\0')) goto LAB_0018dcf7;
          goto LAB_0018dd1f;
        }
        if ((((sVar7 == 'O') && (data[1] == 'T')) && (data[2] == 'T')) && (data[3] == 'O'))
        goto LAB_0018dd1f;
LAB_0018dcf7:
        sVar36 = 0xffffffff;
        if (sVar7 == 't') {
          if (data[1] == 't') {
            if ((data[2] == 'c') && (data[3] == 'f')) {
              uVar37 = *(uint *)(data + 4);
              uVar37 = uVar37 >> 0x18 | (uVar37 & 0xff0000) >> 8 | (uVar37 & 0xff00) << 8 |
                       uVar37 << 0x18;
              if (((uVar37 == 0x20000) || (uVar37 == 0x10000)) &&
                 (uVar37 = *(uint *)(data + 8),
                 iVar38 < (int)(uVar37 >> 0x18 | (uVar37 & 0xff0000) >> 8 | (uVar37 & 0xff00) << 8 |
                               uVar37 << 0x18))) {
                uVar37 = *(uint *)(data + (long)iVar38 * 4 + 0xc);
                sVar36 = uVar37 >> 0x18 | (uVar37 & 0xff0000) >> 8 | (uVar37 & 0xff00) << 8 |
                         uVar37 << 0x18;
              }
            }
          }
          else if (((data[1] == 'r') && (data[2] == 'u')) && (data[3] == 'e')) goto LAB_0018dd1f;
        }
      }
      uStack_498._0_2_ = SUB82(pIVar66,0);
      uStack_498._2_2_ = (undefined2)((ulong)pIVar66 >> 0x10);
      uStack_494 = (undefined2)((ulong)pIVar66 >> 0x20);
      uStack_492 = (undefined2)((ulong)pIVar66 >> 0x30);
      if ((int)sVar36 < 0) {
        __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                      ,0x88d,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(stbtt_uint8 **)((long)pvVar43 + lVar64 * 0x110 + 8) = data;
      *(stbtt_uint32 *)((long)pvVar43 + lVar64 * 0x110 + 0x10) = sVar36;
      *(undefined8 *)((long)pvVar43 + lVar64 * 0x110 + 0x40) = 0;
      *(undefined8 *)((long)pvVar43 + lVar64 * 0x110 + 0x48) = 0;
      __s = pvVar43;
      sVar31 = stbtt__find_table(data,sVar36,"cmap");
      sVar32 = stbtt__find_table(data,sVar36,"loca");
      *(stbtt_uint32 *)((long)pvVar43 + lVar64 * 0x110 + 0x18) = sVar32;
      sVar33 = stbtt__find_table(data,sVar36,"head");
      auStack_488._0_4_ = sVar33;
      *(stbtt_uint32 *)((long)pvVar43 + lVar64 * 0x110 + 0x1c) = sVar33;
      sVar33 = stbtt__find_table(data,sVar36,"glyf");
      auStack_468._0_4_ = sVar33;
      *(stbtt_uint32 *)((long)pvVar43 + lVar64 * 0x110 + 0x20) = sVar33;
      sVar33 = stbtt__find_table(data,sVar36,"hhea");
      *(stbtt_uint32 *)((long)pvVar43 + lVar64 * 0x110 + 0x24) = sVar33;
      sVar34 = stbtt__find_table(data,sVar36,"hmtx");
      *(stbtt_uint32 *)((long)pvVar43 + lVar64 * 0x110 + 0x28) = sVar34;
      sVar35 = stbtt__find_table(data,sVar36,"kern");
      *(stbtt_uint32 *)((long)pvVar43 + lVar64 * 0x110 + 0x2c) = sVar35;
      sVar35 = stbtt__find_table(data,sVar36,"GPOS");
      auVar84 = in_ZMM8._0_16_;
      auVar114 = in_ZMM3._0_16_;
      *(stbtt_uint32 *)((long)pvVar43 + lVar64 * 0x110 + 0x30) = sVar35;
      uStack_498 = (float)CONCAT22(uStack_498._2_2_,(undefined2)uStack_498);
      if ((((sVar31 == 0) ||
           (uStack_498 = (float)CONCAT22(uStack_498._2_2_,(undefined2)uStack_498),
           auStack_488._0_4_ == 0)) ||
          (uStack_498 = (float)CONCAT22(uStack_498._2_2_,(undefined2)uStack_498), sVar33 == 0)) ||
         (uStack_498 = (float)CONCAT22(uStack_498._2_2_,(undefined2)uStack_498), sVar34 == 0))
      goto LAB_00190cba;
      if (auStack_468._0_4_ == 0) {
        uStack_438 = CONCAT44(uStack_438._4_4_,2);
        auStack_4b0 = (undefined1  [8])((ulong)auStack_4b0 & 0xffffffff00000000);
        uStack_408._0_4_ = 0;
        sStack_4bc = 0;
        sVar33 = stbtt__find_table(data,sVar36,"CFF ");
        uStack_498 = (float)CONCAT22(uStack_498._2_2_,(undefined2)uStack_498);
        if (sVar33 == 0) goto LAB_00190cba;
        *(undefined8 *)((long)pvVar43 + lVar64 * 0x110 + 0x80) = 0;
        *(undefined8 *)((long)pvVar43 + lVar64 * 0x110 + 0x88) = 0;
        *(undefined8 *)((long)pvVar43 + lVar64 * 0x110 + 0x90) = 0;
        *(undefined8 *)((long)pvVar43 + lVar64 * 0x110 + 0x98) = 0;
        *(stbtt_uint8 **)((long)pvVar43 + lVar64 * 0x110 + 0x40) = data + sVar33;
        *(undefined8 *)((long)pvVar43 + lVar64 * 0x110 + 0x48) = 0x2000000000000000;
        asStack_298[0].data = *(uchar **)((long)pvVar43 + lVar64 * 0x110 + 0x40);
        asStack_298[0]._8_8_ = *(undefined8 *)((long)pvVar43 + lVar64 * 0x110 + 0x48);
        if ((long)asStack_298[0].cursor < -2) {
LAB_00190f10:
          __assert_fail("!(o > b->size || o < 0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                        ,0x46c,"void stbtt__buf_seek(stbtt__buf *, int)");
        }
        lVar69 = (long)asStack_298[0].cursor + 2;
        iVar38 = (int)lVar69;
        if (asStack_298[0].size < iVar38) goto LAB_00190f10;
        uVar37 = 0;
        if (iVar38 < asStack_298[0].size) {
          iVar38 = asStack_298[0].cursor + 3;
          uVar37 = (uint)asStack_298[0].data[lVar69];
        }
        asStack_298[0].cursor = iVar38;
        if (asStack_298[0].size < (int)uVar37) goto LAB_00190f10;
        asStack_298[0].cursor = uVar37;
        in_ZMM3 = ZEXT1664(auVar114);
        in_ZMM8 = ZEXT1664(auVar84);
        stbtt__cff_get_index(asStack_298);
        sVar153 = stbtt__cff_get_index(asStack_298);
        auStack_4a8 = (undefined1  [16])stbtt__cff_index_get(sVar153,0);
        stbtt__cff_get_index(asStack_298);
        sVar153 = stbtt__cff_get_index(asStack_298);
        *(stbtt__buf *)((long)pvVar43 + lVar64 * 0x110 + 0x60) = sVar153;
        stbtt__dict_get_ints((stbtt__buf *)auStack_4a8,0x11,1,(stbtt_uint32 *)auStack_4b0);
        stbtt__dict_get_ints((stbtt__buf *)auStack_4a8,0x106,1,(stbtt_uint32 *)&uStack_438);
        stbtt__dict_get_ints((stbtt__buf *)auStack_4a8,0x124,1,(stbtt_uint32 *)&uStack_408);
        stbtt__dict_get_ints((stbtt__buf *)auStack_4a8,0x125,1,&sStack_4bc);
        sVar153.size = sVar32;
        sVar153.data = (uchar *)in_stack_fffffffffffffb00._0_8_;
        sVar153.cursor = in_stack_fffffffffffffb00._8_4_;
        fontdict.cursor = uVar154;
        fontdict.data = (uchar *)__s;
        fontdict.size = iVar155;
        sVar153 = stbtt__get_subrs(sVar153,fontdict);
        sVar32 = sStack_4bc;
        *(stbtt__buf *)((long)pvVar43 + lVar64 * 0x110 + 0x70) = sVar153;
        uStack_498 = (float)CONCAT22(uStack_498._2_2_,(undefined2)uStack_498);
        if (((stbtt_uint32)uStack_438 != 2) ||
           (uVar54 = auStack_4b0._0_4_,
           uStack_498 = (float)CONCAT22(uStack_498._2_2_,(undefined2)uStack_498),
           auStack_4b0._0_4_ == 0)) goto LAB_00190cba;
        if ((stbtt_uint32)uStack_408 != 0) {
          uVar40 = (ulong)sStack_4bc;
          uStack_498 = (float)CONCAT22(uStack_498._2_2_,(undefined2)uStack_498);
          if (uVar40 == 0) goto LAB_00190cba;
          if (((int)(stbtt_uint32)uStack_408 < 0) ||
             (asStack_298[0].size < (int)(stbtt_uint32)uStack_408)) goto LAB_00190f10;
          asStack_298[0].cursor = (stbtt_uint32)uStack_408;
          sVar153 = stbtt__cff_get_index(asStack_298);
          *(stbtt__buf *)((long)pvVar43 + lVar64 * 0x110 + 0x80) = sVar153;
          puVar44 = asStack_298[0].data + uVar40;
          lVar69 = (ulong)(asStack_298[0].size - sVar32) << 0x20;
          if ((int)(asStack_298[0].size - sVar32 | sVar32) < 0 || asStack_298[0].size < (int)sVar32)
          {
            puVar44 = (uchar *)0x0;
            lVar69 = 0;
          }
          *(uchar **)((long)pvVar43 + lVar64 * 0x110 + 0x90) = puVar44;
          *(long *)((long)pvVar43 + lVar64 * 0x110 + 0x98) = lVar69;
        }
        if (((int)uVar54 < 0) || (asStack_298[0].size < (int)uVar54)) goto LAB_00190f10;
        asStack_298[0].cursor = uVar54;
        sVar153 = stbtt__cff_get_index(asStack_298);
        *(stbtt__buf *)((long)pvVar43 + lVar64 * 0x110 + 0x50) = sVar153;
      }
      else {
        uStack_498 = (float)CONCAT22(uStack_498._2_2_,(undefined2)uStack_498);
        if (sVar32 == 0) goto LAB_00190cba;
      }
      sVar36 = stbtt__find_table(data,sVar36,"maxp");
      if (sVar36 == 0) {
        uVar37 = 0xffff;
      }
      else {
        uVar37 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar36 + 4) << 8 |
                               *(ushort *)(data + (ulong)sVar36 + 4) >> 8);
      }
      *(uint *)((long)pvVar43 + lVar64 * 0x110 + 0x14) = uVar37;
      uVar30 = *(ushort *)(data + (ulong)sVar31 + 2) << 8 |
               *(ushort *)(data + (ulong)sVar31 + 2) >> 8;
      *(undefined4 *)((long)pvVar43 + lVar64 * 0x110 + 0x34) = 0;
      if (uVar30 != 0) {
        uVar37 = sVar31 + 4;
        uVar40 = (ulong)uVar30;
        do {
          uVar30 = *(ushort *)(data + uVar37) << 8 | *(ushort *)(data + uVar37) >> 8;
          if ((uVar30 == 0) ||
             ((uVar30 == 3 &&
              ((uVar30 = *(ushort *)(data + (ulong)uVar37 + 2) << 8 |
                         *(ushort *)(data + (ulong)uVar37 + 2) >> 8, uVar30 == 10 || (uVar30 == 1)))
              ))) {
            uVar70 = *(uint *)(data + (ulong)uVar37 + 4);
            *(uint *)((long)pvVar43 + lVar64 * 0x110 + 0x34) =
                 (uVar70 >> 0x18 | (uVar70 & 0xff0000) >> 8 | (uVar70 & 0xff00) << 8 |
                 uVar70 << 0x18) + sVar31;
          }
          uVar37 = uVar37 + 8;
          uVar40 = uVar40 - 1;
        } while (uVar40 != 0);
      }
      uStack_498 = (float)CONCAT22(uStack_498._2_2_,(undefined2)uStack_498);
      if (*(int *)((long)pvVar43 + lVar64 * 0x110 + 0x34) == 0) goto LAB_00190cba;
      *(uint *)((long)pvVar43 + lVar64 * 0x110 + 0x38) =
           (uint)(ushort)(*(ushort *)
                           (data + (long)*(int *)((long)pvVar43 + lVar64 * 0x110 + 0x1c) + 0x32) <<
                          8 | *(ushort *)
                               (data + (long)*(int *)((long)pvVar43 + lVar64 * 0x110 + 0x1c) + 0x32)
                              >> 8);
      iVar38 = *(int *)((long)pvVar43 + lVar64 * 0x110 + 0xe0);
      if (((long)iVar38 < 0) || (auStack_448._0_4_ <= iVar38)) goto LAB_00190e65;
      pIVar50 = *(ImWchar **)
                 (CONCAT26(uStack_492,
                           CONCAT24(uStack_494,CONCAT22(uStack_498._2_2_,(undefined2)uStack_498))) +
                 0x38);
      if (pIVar50 == (ImWchar *)0x0) {
        pIVar50 = GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)pvVar43 + lVar64 * 0x110 + 0xd8) = pIVar50;
      IVar10 = *pIVar50;
      while (IVar10 != 0) {
        uVar30 = pIVar50[1];
        if (uVar30 == 0) break;
        uVar37 = *(uint *)((long)pvVar43 + lVar64 * 0x110 + 0xe4);
        uVar70 = (uint)uVar30;
        if ((int)(uint)uVar30 < (int)uVar37) {
          uVar70 = uVar37;
        }
        *(uint *)((long)pvVar43 + lVar64 * 0x110 + 0xe4) = uVar70;
        IVar10 = pIVar50[2];
        pIVar50 = pIVar50 + 2;
      }
      piVar41 = (int *)((long)iVar38 * 0x20 + (long)pvStack_450);
      *piVar41 = *piVar41 + 1;
      iVar38 = *(int *)((long)pvVar43 + lVar64 * 0x110 + 0xe4);
      if (iVar38 < piVar41[1]) {
        iVar38 = piVar41[1];
      }
      piVar41[1] = iVar38;
      lVar64 = lVar64 + 1;
      uVar40 = (ulong)(pIStack_4b8->ConfigData).Size;
      bStack_4e1 = (long)uVar40 <= lVar64;
      lVar69 = auStack_448._0_8_;
      pvVar43 = __s;
    } while (lVar64 < (long)uVar40);
  }
  uStack_4f0 = 0;
  lVar64 = CONCAT44(iVar155,uVar154);
  if (0 < (int)uVar154) {
    lVar51 = 0;
    uStack_4f0 = 0;
    do {
      iVar38 = *(int *)((long)__s + lVar51 * 0x110 + 0xe0);
      lVar64 = (long)iVar38;
      if ((lVar64 < 0) || ((int)lVar69 <= iVar38)) goto LAB_00190e65;
      auStack_488._0_8_ = lVar51;
      psVar71 = (stbtt_fontinfo *)(lVar51 * 0x110 + (long)__s);
      ImBitVector::Create((ImBitVector *)&psVar71[1].charstrings,
                          *(int *)((long)&psVar71[1].cff.data + 4) + 1);
      pvVar43 = pvStack_450;
      this_00 = (ImBitVector *)((long)pvStack_450 + lVar64 * 0x20 + 0x10);
      if (*(int *)((long)pvStack_450 + lVar64 * 0x20 + 0x10) == 0) {
        ImBitVector::Create(this_00,*(int *)((long)pvStack_450 + lVar64 * 0x20 + 4) + 1);
      }
      puVar61 = *(ushort **)&psVar71[1].indexToLocFormat;
      uVar30 = *puVar61;
      for (; (uVar30 != 0 && (puVar61[1] != 0)); puVar61 = puVar61 + 2) {
        if (uVar30 <= puVar61[1]) {
          uVar37 = (uint)uVar30;
          do {
            bVar29 = ImBitVector::TestBit(this_00,uVar37);
            if ((!bVar29) && (iVar38 = stbtt_FindGlyphIndex(psVar71,uVar37), iVar38 != 0)) {
              piVar41 = &psVar71[1].cff.cursor;
              *piVar41 = *piVar41 + 1;
              piVar41 = (int *)((long)pvVar43 + lVar64 * 0x20 + 8);
              *piVar41 = *piVar41 + 1;
              ImBitVector::SetBit((ImBitVector *)&psVar71[1].charstrings,uVar37);
              ImBitVector::SetBit(this_00,uVar37);
              uStack_4f0 = uStack_4f0 + 1;
            }
            bVar29 = uVar37 < puVar61[1];
            uVar37 = uVar37 + 1;
          } while (bVar29);
        }
        uVar30 = puVar61[2];
      }
      lVar51 = auStack_488._0_8_ + 1;
      lVar64 = CONCAT44(iVar155,uVar154);
      lVar69 = auStack_448._0_8_;
    } while (lVar51 != lVar64);
  }
  if (0 < (int)lVar64) {
    lVar69 = 0;
    pvVar43 = __s;
    do {
      uStack_498._0_2_ = (undefined2)lVar69;
      uStack_498._2_2_ = (undefined2)((ulong)lVar69 >> 0x10);
      uStack_494 = (undefined2)((ulong)lVar69 >> 0x20);
      uStack_492 = (undefined2)((ulong)lVar69 >> 0x30);
      lVar69 = lVar69 * 0x110;
      iVar38 = *(int *)((long)pvVar43 + lVar69 + 0xe8);
      __s = pvVar43;
      if (*(int *)((long)pvVar43 + lVar69 + 0x104) < iVar38) {
        pvVar42 = ImGui::MemAlloc((long)iVar38 << 2);
        pvVar14 = *(void **)((long)pvVar43 + lVar69 + 0x108);
        if (pvVar14 != (void *)0x0) {
          memcpy(pvVar42,pvVar14,(long)*(int *)((long)pvVar43 + lVar69 + 0x100) << 2);
          ImGui::MemFree(*(void **)((long)pvVar43 + lVar69 + 0x108));
        }
        *(void **)((long)pvVar43 + lVar69 + 0x108) = pvVar42;
        *(int *)((long)pvVar43 + lVar69 + 0x104) = iVar38;
      }
      lVar64 = (long)*(int *)((long)pvVar43 + lVar69 + 0xf0);
      if (0 < lVar64) {
        puVar52 = *(uint **)((long)pvVar43 + lVar69 + 0xf8);
        auStack_468._0_8_ = puVar52 + lVar64;
        iVar38 = 0;
        do {
          auStack_488._0_8_ = puVar52;
          uVar37 = *puVar52;
          if (uVar37 != 0) {
            uVar70 = 0;
            do {
              if ((uVar37 >> (uVar70 & 0x1f) & 1) != 0) {
                iVar68 = *(int *)((long)pvVar43 + lVar69 + 0x100);
                iVar39 = *(int *)((long)pvVar43 + lVar69 + 0x104);
                if (iVar68 == iVar39) {
                  if (iVar39 == 0) {
                    iVar48 = 8;
                  }
                  else {
                    iVar48 = iVar39 / 2 + iVar39;
                  }
                  iVar68 = iVar68 + 1;
                  if (iVar68 < iVar48) {
                    iVar68 = iVar48;
                  }
                  if (iVar39 < iVar68) {
                    pvVar42 = ImGui::MemAlloc((long)iVar68 << 2);
                    pvVar14 = *(void **)((long)pvVar43 + lVar69 + 0x108);
                    if (pvVar14 != (void *)0x0) {
                      memcpy(pvVar42,pvVar14,(long)*(int *)((long)pvVar43 + lVar69 + 0x100) << 2);
                      ImGui::MemFree(*(void **)((long)pvVar43 + lVar69 + 0x108));
                    }
                    *(void **)((long)pvVar43 + lVar69 + 0x108) = pvVar42;
                    *(int *)((long)pvVar43 + lVar69 + 0x104) = iVar68;
                  }
                }
                *(uint *)(*(long *)((long)pvVar43 + lVar69 + 0x108) +
                         (long)*(int *)((long)pvVar43 + lVar69 + 0x100) * 4) = iVar38 + uVar70;
                piVar41 = (int *)((long)pvVar43 + lVar69 + 0x100);
                *piVar41 = *piVar41 + 1;
              }
              uVar70 = uVar70 + 1;
            } while (uVar70 != 0x20);
          }
          puVar52 = (uint *)(auStack_488._0_8_ + 4);
          iVar38 = iVar38 + 0x20;
        } while (puVar52 < (ulong)auStack_468._0_8_);
      }
      pvVar14 = *(void **)((long)pvVar43 + lVar69 + 0xf8);
      lVar64 = CONCAT44(iVar155,uVar154);
      if (pvVar14 != (void *)0x0) {
        *(undefined8 *)((long)pvVar43 + lVar69 + 0xf0) = 0;
        ImGui::MemFree(pvVar14);
        *(undefined8 *)((long)pvVar43 + lVar69 + 0xf8) = 0;
      }
      if (*(int *)((long)pvVar43 + lVar69 + 0x100) != *(int *)((long)pvVar43 + lVar69 + 0xe8)) {
        __assert_fail("src_tmp.GlyphsList.Size == src_tmp.GlyphsCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                      ,0x8bc,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      lVar69 = CONCAT26(uStack_492,
                        CONCAT24(uStack_494,CONCAT22(uStack_498._2_2_,(undefined2)uStack_498))) + 1;
      pvVar43 = __s;
    } while (lVar69 != lVar64);
  }
  sVar28 = sStack_390;
  pvVar43 = pvStack_450;
  if (0 < (int)auStack_448._0_4_) {
    sVar59 = 0;
    do {
      pvVar14 = *(void **)((long)pvVar43 + sVar59 + 0x18);
      if (pvVar14 != (void *)0x0) {
        *(undefined8 *)((long)pvVar43 + sVar59 + 0x10) = 0;
        ImGui::MemFree(pvVar14);
        *(undefined8 *)((long)pvVar43 + sVar59 + 0x18) = 0;
      }
      sVar59 = sVar59 + 0x20;
    } while (sVar28 != sVar59);
  }
  if (pvStack_450 != (void *)0x0) {
    ImGui::MemFree(pvStack_450);
    pvStack_450 = (void *)0x0;
  }
  pIVar73 = pIStack_4b8;
  auStack_4a8 = ZEXT816(0);
  uStack_438 = 0;
  pvStack_430 = (void *)0x0;
  if (0 < (int)uStack_4f0) {
    uVar37 = 8;
    if (7 < (int)uStack_4f0) {
      uVar37 = uStack_4f0;
    }
    if (0 < (int)uVar37) {
      pvVar43 = ImGui::MemAlloc((long)(int)uVar37 << 4);
      if ((void *)auStack_4a8._8_8_ != (void *)0x0) {
        memcpy(pvVar43,(void *)auStack_4a8._8_8_,(long)(int)auStack_4a8._0_4_ << 4);
        ImGui::MemFree((void *)auStack_4a8._8_8_);
      }
      auVar114._4_8_ = pvVar43;
      auVar114._0_4_ = uVar37;
      auVar114._12_4_ = 0;
      auStack_4a8 = auVar114 << 0x20;
    }
  }
  auStack_4a8._0_4_ = uStack_4f0;
  if (uStack_438._4_4_ < (int)uStack_4f0) {
    if (uStack_438._4_4_ == 0) {
      uVar37 = 8;
    }
    else {
      uVar37 = uStack_438._4_4_ / 2 + uStack_438._4_4_;
    }
    if ((int)uVar37 <= (int)uStack_4f0) {
      uVar37 = uStack_4f0;
    }
    if (uStack_438._4_4_ < (int)uVar37) {
      pvVar43 = ImGui::MemAlloc((long)(int)uVar37 * 0x1c);
      if (pvStack_430 != (void *)0x0) {
        memcpy(pvVar43,pvStack_430,(long)(int)(stbtt_uint32)uStack_438 * 0x1c);
        ImGui::MemFree(pvStack_430);
      }
      uStack_438 = (ulong)uVar37 << 0x20;
      pvStack_430 = pvVar43;
    }
  }
  uStack_438 = CONCAT44(uStack_438._4_4_,uStack_4f0);
  iVar38 = 0;
  memset((void *)auStack_4a8._8_8_,0,(long)(int)auStack_4a8._0_4_ << 4);
  memset(pvStack_430,0,(long)(int)(stbtt_uint32)uStack_438 * 0x1c);
  fVar93 = (float)CONCAT22(uStack_498._2_2_,(undefined2)uStack_498);
  auVar84 = ZEXT816(0) << 0x40;
  if (0 < (int)uVar154) {
    auStack_448._8_4_ = 0x80000000;
    auStack_448._0_8_ = 0x8000000080000000;
    auStack_448._12_4_ = 0x80000000;
    lVar69 = 0;
    uVar37 = 0;
    uStack_498 = 0.0;
    do {
      iVar68 = *(int *)((long)__s + lVar69 * 0x110 + 0xe8);
      if (iVar68 != 0) {
        if (((int)uVar37 < 0) || ((int)auStack_4a8._0_4_ <= (int)uVar37)) {
          __function = "T &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]";
          goto LAB_00190de1;
        }
        psVar71 = (stbtt_fontinfo *)(lVar69 * 0x110 + (long)__s);
        *(ulong *)&psVar71[1].hmtx = (ulong)uVar37 * 0x10 + auStack_4a8._8_8_;
        if (((int)uStack_498 < 0) || ((int)(stbtt_uint32)uStack_438 <= (int)uStack_498)) {
          __function = "T &ImVector<stbtt_packedchar>::operator[](int) [T = stbtt_packedchar]";
          goto LAB_00190de1;
        }
        pvVar43 = (void *)((ulong)(uint)uStack_498 * 0x1c + (long)pvStack_430);
        *(void **)&psVar71[1].gpos = pvVar43;
        if ((pIVar73->ConfigData).Size <= lVar69) goto LAB_00190e4b;
        pIVar66 = (pIVar73->ConfigData).Data;
        fVar75 = pIVar66[lVar69].SizePixels;
        *(float *)&psVar71[1].userdata = fVar75;
        *(undefined4 *)((long)&psVar71[1].userdata + 4) = 0;
        psVar71[1].data = *(uchar **)&psVar71[1].gsubrs.cursor;
        psVar71[1].fontstart = *(int *)&psVar71[1].gsubrs.data;
        *(void **)&psVar71[1].loca = pvVar43;
        *(char *)&psVar71[1].glyf = (char)pIVar66[lVar69].OversampleH;
        *(char *)((long)&psVar71[1].glyf + 1) = (char)pIVar66[lVar69].OversampleV;
        if (fVar75 <= 0.0) {
          fVar75 = (float)((uint)fVar75 ^ auStack_448._0_4_);
          uVar70 = (uint)(ushort)(*(ushort *)(psVar71->data + (long)psVar71->head + 0x12) << 8 |
                                 *(ushort *)(psVar71->data + (long)psVar71->head + 0x12) >> 8);
        }
        else {
          puVar44 = psVar71->data;
          lVar64 = (long)psVar71->hhea;
          uVar70 = ((int)(short)((ushort)puVar44[lVar64 + 4] << 8) | (uint)puVar44[lVar64 + 5]) -
                   ((int)(short)((ushort)puVar44[lVar64 + 6] << 8) | (uint)puVar44[lVar64 + 7]);
        }
        fVar75 = fVar75 / (float)(int)uVar70;
        uVar37 = uVar37 + iVar68;
        uStack_498 = (float)((int)uStack_498 + iVar68);
        if (0 < *(int *)&psVar71[1].gsubrs.data) {
          auStack_468._0_4_ = uVar37;
          auStack_488._0_8_ = lVar69;
          iVar68 = pIVar73->TexGlyphPadding;
          lVar51 = 6;
          lVar64 = 0;
          do {
            if (*(int *)&psVar71[1].gsubrs.data <= lVar64) goto LAB_00190dcc;
            iVar39 = stbtt_FindGlyphIndex
                               (psVar71,*(int *)(*(long *)&psVar71[1].gsubrs.cursor + lVar64 * 4));
            if (iVar39 == 0) {
              __assert_fail("glyph_index_in_font != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                            ,0x8eb,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
            }
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar71,iVar39,fVar75 * (float)pIVar66[lVar69].OversampleH,
                       fVar75 * (float)pIVar66[lVar69].OversampleV,fVar75,in_ZMM3._0_4_,
                       (int *)asStack_298,(int *)auStack_4b0,(int *)&uStack_408,(int *)&sStack_4bc);
            uVar37 = (pIVar66[lVar69].OversampleH +
                     (((stbtt_uint32)uStack_408 + iVar68) - (int)asStack_298[0].data)) - 1;
            lVar55 = *(long *)&psVar71[1].hmtx;
            *(short *)(lVar55 + -2 + lVar51) = (short)uVar37;
            uVar70 = (pIVar66[lVar69].OversampleV + ((sStack_4bc + iVar68) - auStack_4b0._0_4_)) - 1
            ;
            *(short *)(lVar55 + lVar51) = (short)uVar70;
            iVar38 = iVar38 + (uVar70 & 0xffff) * (uVar37 & 0xffff);
            lVar64 = lVar64 + 1;
            lVar51 = lVar51 + 0x10;
          } while (lVar64 < *(int *)&psVar71[1].gsubrs.data);
          lVar69 = auStack_488._0_8_;
          pIVar73 = pIStack_4b8;
          uVar37 = auStack_468._0_4_;
          fVar93 = uStack_498;
        }
      }
      lVar69 = lVar69 + 1;
    } while (lVar69 != CONCAT44(iVar155,uVar154));
    auVar84._0_4_ = (float)iVar38;
    auVar84._4_12_ = in_ZMM3._4_12_;
  }
  uStack_498 = fVar93;
  if (auVar84._0_4_ < 0.0) {
    fVar93 = sqrtf(auVar84._0_4_);
  }
  else {
    auVar114 = vsqrtss_avx(auVar84,auVar84);
    fVar93 = auVar114._0_4_;
  }
  pIVar73->TexHeight = 0;
  iVar38 = pIVar73->TexDesiredWidth;
  if (iVar38 < 1) {
    iVar68 = (int)fVar93;
    iVar38 = 0x1000;
    if ((iVar68 < 0xb33) && (iVar38 = 0x800, iVar68 < 0x599)) {
      iVar38 = (uint)(0x2cb < iVar68) * 0x200 + 0x200;
    }
  }
  pIVar73->TexWidth = iVar38;
  iVar68 = pIVar73->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar39 = iVar38 - iVar68;
  psStack_420 = (stbrp_node *)ImGui::MemAlloc((long)iVar39 << 4);
  if ((ptr == (stbrp_context *)0x0) || (psStack_420 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (psStack_420 != (stbrp_node *)0x0) {
      ImGui::MemFree(psStack_420);
    }
    psStack_420 = (stbrp_node *)0x0;
    iVar68 = 0;
    iVar38 = 0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    if ((iVar68 < -0x7fff) || (0xffff < iVar39)) {
      __assert_fail("width <= 0xffff && height <= 0xffff",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_rectpack.h"
                    ,0x10a,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
    }
    if (iVar39 < 2) {
      uVar40 = 0;
    }
    else {
      uVar40 = 0;
      psVar22 = psStack_420;
      do {
        uVar40 = uVar40 + 1;
        psVar22->next = psVar22 + 1;
        psVar22 = psVar22 + 1;
      } while (iVar39 - 1 != uVar40);
      uVar40 = uVar40 & 0xffffffff;
    }
    psStack_420[uVar40].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = psStack_420;
    ptr->active_head = ptr->extra;
    ptr->width = iVar39;
    ptr->height = 0x8000 - iVar68;
    ptr->num_nodes = iVar39;
    ptr->align = (iVar39 * 2 + -1) / iVar39;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)iVar39;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  psStack_358 = ptr;
  ImFontAtlasBuildPackCustomRects(pIStack_4b8,ptr);
  if (0 < (int)uVar154) {
    lVar69 = 0;
    pvVar43 = __s;
    do {
      lVar64 = lVar69 * 0x110;
      iVar39 = *(int *)((long)pvVar43 + lVar64 + 0xe8);
      __s = pvVar43;
      if (iVar39 != 0) {
        stbrp_pack_rects(psStack_358,*(stbrp_rect **)((long)pvVar43 + lVar64 + 200),iVar39);
        lVar51 = (long)*(int *)((long)pvVar43 + lVar64 + 0xe8);
        if (0 < lVar51) {
          lVar64 = *(long *)((long)pvVar43 + lVar64 + 200);
          lVar55 = 0;
          do {
            if (*(int *)(lVar64 + 0xc + lVar55) != 0) {
              iVar39 = (uint)*(ushort *)(lVar64 + 6 + lVar55) +
                       (uint)*(ushort *)(lVar64 + 10 + lVar55);
              if (iVar39 < pIStack_4b8->TexHeight) {
                iVar39 = pIStack_4b8->TexHeight;
              }
              pIStack_4b8->TexHeight = iVar39;
            }
            lVar55 = lVar55 + 0x10;
          } while (lVar51 * 0x10 != lVar55);
        }
      }
      lVar69 = lVar69 + 1;
      pvVar43 = __s;
    } while (lVar69 != CONCAT44(iVar155,uVar154));
  }
  uVar37 = pIStack_4b8->TexHeight;
  if ((pIStack_4b8->Flags & 1) == 0) {
    uVar37 = (int)(uVar37 - 1) >> 1 | uVar37 - 1;
    uVar37 = (int)uVar37 >> 2 | uVar37;
    uVar37 = (int)uVar37 >> 4 | uVar37;
    uVar37 = (int)uVar37 >> 8 | uVar37;
    uVar37 = (int)uVar37 >> 0x10 | uVar37;
  }
  iVar39 = uVar37 + 1;
  pIStack_4b8->TexHeight = iVar39;
  auVar114 = vpinsrd_avx(ZEXT416((uint)pIStack_4b8->TexWidth),iVar39,1);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar90._8_4_ = 0x3f800000;
  auVar90._0_8_ = 0x3f8000003f800000;
  auVar90._12_4_ = 0x3f800000;
  auVar114 = vdivps_avx(auVar90,auVar114);
  IVar3 = (ImVec2)vmovlps_avx(auVar114);
  pIStack_4b8->TexUvScale = IVar3;
  puVar44 = (uchar *)ImGui::MemAlloc((long)(iVar39 * pIStack_4b8->TexWidth));
  pIVar73 = pIStack_4b8;
  pIStack_4b8->TexPixelsAlpha8 = puVar44;
  memset(puVar44,0,(long)pIStack_4b8->TexHeight * (long)pIStack_4b8->TexWidth);
  if (0 < (int)uVar154) {
    puStack_3c0 = pIVar73->TexPixelsAlpha8;
    lVar69 = (long)iVar38;
    uStack_68 = (undefined2)iVar68;
    uStack_66 = uStack_68;
    uStack_64 = uStack_68;
    uStack_62 = uStack_68;
    uStack_60 = uStack_68;
    uStack_5e = uStack_68;
    uStack_5c = uStack_68;
    uStack_5a = uStack_68;
    lVar64 = 0;
    uStack_88 = 1;
    uStack_86 = 1;
    uStack_84 = 1;
    uStack_82 = 1;
    uStack_80 = 1;
    uStack_7e = 1;
    uStack_7c = 1;
    uStack_7a = 1;
    auStack_318._8_4_ = 0x80000000;
    auStack_318._0_8_ = 0x8000000080000000;
    auStack_318._12_4_ = 0x80000000;
    iStack_380 = iVar38;
    puVar52 = extraout_RDX;
    do {
      lStack_3d0 = lVar64;
      fVar93 = uStack_498;
      if ((pIVar73->ConfigData).Size <= lVar64) goto LAB_00190e4b;
      if (*(int *)((long)__s + lVar64 * 0x110 + 0xe8) != 0) {
        psVar71 = (stbtt_fontinfo *)(lVar64 * 0x110 + (long)__s);
        fStack_328 = *(float *)&psVar71[1].userdata;
        if (fStack_328 <= 0.0) {
          fStack_328 = (float)((uint)fStack_328 ^ auStack_318._0_4_);
          uVar37 = (uint)(ushort)(*(ushort *)(psVar71->data + (long)psVar71->head + 0x12) << 8 |
                                 *(ushort *)(psVar71->data + (long)psVar71->head + 0x12) >> 8);
          uStack_324 = auStack_318._4_4_;
          uStack_320 = auStack_318._8_4_;
          uStack_31c = auStack_318._12_4_;
        }
        else {
          puVar44 = psVar71->data;
          lVar64 = (long)psVar71->hhea;
          uVar37 = ((int)(short)((ushort)puVar44[lVar64 + 4] << 8) | (uint)puVar44[lVar64 + 5]) -
                   ((int)(short)((ushort)puVar44[lVar64 + 6] << 8) | (uint)puVar44[lVar64 + 7]);
          puVar52 = (uint *)0x0;
          uStack_324 = 0;
          uStack_320 = 0;
          uStack_31c = 0;
        }
        fStack_328 = fStack_328 / (float)(int)uVar37;
        pIStack_2f8 = (pIVar73->ConfigData).Data;
        if (0 < psVar71[1].fontstart) {
          lVar64._0_4_ = psVar71[1].hmtx;
          lVar64._4_4_ = psVar71[1].kern;
          uVar40._0_4_ = psVar71[1].glyf;
          uVar40._4_4_ = psVar71[1].hhea;
          auVar77._8_8_ = 0;
          auVar77._0_8_ = uVar40;
          auVar17 = vpmovzxbw_avx(auVar77);
          auVar114 = vpmovzxbd_avx(auVar77);
          auVar114 = vcvtdq2ps_avx(auVar114);
          auVar97._8_4_ = 0x3f800000;
          auVar97._0_8_ = 0x3f8000003f800000;
          auVar97._12_4_ = 0x3f800000;
          auStack_48 = vdivps_avx(auVar97,auVar114);
          auVar78._8_8_ = 0;
          auVar78._0_8_ = uVar40;
          auVar84 = vpcmpeqb_avx(auVar78,_DAT_001df0b0);
          auVar90 = vpmovsxbd_avx(auVar84);
          auVar25._2_2_ = uStack_86;
          auVar25._0_2_ = uStack_88;
          auVar25._4_2_ = uStack_84;
          auVar25._6_2_ = uStack_82;
          auVar25._8_2_ = uStack_80;
          auVar25._10_2_ = uStack_7e;
          auVar25._12_2_ = uStack_7c;
          auVar25._14_2_ = uStack_7a;
          auVar84 = vpsubw_avx(auVar25,auVar17);
          auVar84 = vpmovsxwd_avx(auVar84);
          auVar84 = vcvtdq2ps_avx(auVar84);
          fVar93 = auVar114._0_4_;
          auVar106._0_4_ = fVar93 + fVar93;
          fVar75 = auVar114._4_4_;
          auVar106._4_4_ = fVar75 + fVar75;
          fVar105 = auVar114._8_4_;
          auVar106._8_4_ = fVar105 + fVar105;
          fVar109 = auVar114._12_4_;
          auVar106._12_4_ = fVar109 + fVar109;
          auVar114 = vdivps_avx(auVar84,auVar106);
          auStack_58 = vpandn_avx(auVar90,auVar114);
          auStack_2a8._0_4_ = fStack_328 * fVar93;
          auStack_2a8._4_4_ = fStack_328 * fVar75;
          auStack_2a8._8_4_ = fStack_328 * fVar105;
          auStack_2a8._12_4_ = fStack_328 * fVar109;
          auStack_2b8 = vmovshdup_avx(auStack_2a8);
          auVar114 = vminss_avx(auStack_2b8,auStack_2a8);
          auVar101 = ZEXT464(0x3eb33333);
          fVar93 = 0.35 / auVar114._0_4_;
          fStack_3d8 = fVar93 * fVar93;
          uStack_330 = uVar40 & 0xff;
          uStack_338 = uVar40 >> 8 & 0xff;
          auVar79._0_4_ = auStack_2b8._0_4_ ^ auStack_318._0_4_;
          auVar79._4_4_ = auStack_2b8._4_4_ ^ auStack_318._4_4_;
          auVar79._8_4_ = auStack_2b8._8_4_ ^ auStack_318._8_4_;
          auVar79._12_4_ = auStack_2b8._12_4_ ^ auStack_318._12_4_;
          uVar54 = vpextrw_avx(auVar17,1);
          puVar52 = (uint *)CONCAT44((int)((ulong)puVar52 >> 0x20),uVar54);
          uStack_470 = (ulong)(auVar17._0_4_ & 0xffff);
          auVar114 = vunpcklps_avx(auStack_2a8,auVar79);
          uStack_78 = auVar114._0_8_;
          uStack_70 = auVar114._0_8_;
          lVar51 = 0;
          lStack_2f0 = lVar64;
          psStack_350 = psVar71;
          puStack_3e8 = puVar52;
          do {
            if (((*(int *)(lVar64 + 0xc + lVar51 * 0x10) != 0) &&
                (lVar55 = lVar51 * 0x10 + lVar64, *(short *)(lVar55 + 4) != 0)) &&
               (*(short *)(lVar55 + 6) != 0)) {
              if (psVar71[1].data == (uchar *)0x0) {
                iVar38 = *(int *)((long)&psVar71[1].userdata + 4) + (int)lVar51;
              }
              else {
                iVar38 = *(int *)(psVar71[1].data + lVar51 * 4);
              }
              puStack_2e8 = (uint *)(lVar51 * 0x1c + *(long *)&psVar71[1].loca);
              fVar75 = auVar101._0_4_;
              in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
              lStack_2e0 = lVar51;
              iVar68 = stbtt_FindGlyphIndex(psVar71,iVar38);
              fVar93 = (float)CONCAT22(uStack_66,uStack_68);
              auVar17._4_2_ = uStack_64;
              auVar17._0_4_ = fVar93;
              auVar17._6_2_ = uStack_62;
              auVar17._8_2_ = uStack_60;
              auVar17._10_2_ = uStack_5e;
              auVar17._12_2_ = uStack_5c;
              auVar17._14_2_ = uStack_5a;
              auVar80._8_8_ = 0;
              auVar80._0_8_ = *(ulong *)(lVar55 + 4);
              auVar84 = vpsubw_avx(auVar80,auVar17);
              auVar114 = vpaddw_avx(auVar80,auVar17);
              auVar114 = vpblendd_avx2(auVar84,auVar114,2);
              *(long *)(lVar55 + 4) = auVar114._0_8_;
              puVar44 = psVar71->data;
              uVar30 = *(ushort *)(puVar44 + (long)psVar71->hhea + 0x22) << 8 |
                       *(ushort *)(puVar44 + (long)psVar71->hhea + 0x22) >> 8;
              iVar38 = psVar71->hmtx;
              lVar64 = (ulong)uVar30 * 4 + (long)iVar38 + -4;
              lVar51 = (ulong)uVar30 * 4 + (long)iVar38 + -3;
              if (iVar68 < (int)(uint)uVar30) {
                lVar64 = (long)(iVar68 * 4) + (long)iVar38;
                lVar51 = (long)(iVar68 * 4) + 1 + (long)iVar38;
              }
              uStack_384 = (uint)puVar44[lVar64];
              uStack_388 = (uint)puVar44[lVar51];
              stbtt_GetGlyphBitmapBoxSubpixel
                        (psVar71,iVar68,(float)auStack_2a8._0_4_,(float)auStack_2b8._0_4_,fVar93,
                         fVar75,(int *)&uStack_370,&iStack_374,&iStack_2bc,&iStack_2c0);
              auVar114 = auStack_468;
              auStack_468._2_6_ = 0;
              auStack_468._0_2_ = *(ushort *)(lVar55 + 8);
              auStack_468._8_8_ = auVar114._8_8_;
              puStack_3b0 = (uchar *)(ulong)*(ushort *)(lVar55 + 10);
              uStack_418 = (ulong)*(ushort *)(lVar55 + 4);
              uStack_3c8 = (ulong)*(ushort *)(lVar55 + 6);
              lStack_3b8 = lVar55;
              uVar37 = stbtt_GetGlyphShape(psVar71,iVar68,(stbtt_vertex **)&uStack_408);
              uVar70 = ((int)uStack_418 - (int)uStack_470) + 1;
              stbtt_GetGlyphBitmapBoxSubpixel
                        (psStack_350,iVar68,auStack_2a8._0_4_,auStack_2b8._0_4_,fVar93,fVar75,
                         (int *)&sStack_4bc,&iStack_36c,(int *)0x0,(int *)0x0);
              uStack_3fc = uVar70;
              if ((uVar70 != 0) &&
                 (uStack_498 = (float)(((int)uStack_3c8 - (int)puStack_3e8) + 1), uStack_498 != 0.0)
                 ) {
                lVar64 = CONCAT44(uStack_408._4_4_,(stbtt_uint32)uStack_408);
                auStack_448._0_4_ = sStack_4bc;
                asStack_298[0].data = (uchar *)((ulong)asStack_298[0].data & 0xffffffff00000000);
                if ((int)uVar37 < 1) {
                  uVar70 = 0;
                }
                else {
                  lVar51 = 0;
                  uVar70 = 0;
                  do {
                    uVar70 = uVar70 + (*(char *)(lVar64 + 0xc + lVar51) == '\x01');
                    lVar51 = lVar51 + 0xe;
                  } while ((ulong)uVar37 * 0xe != lVar51);
                }
                iStack_3dc = iStack_36c;
                if (uVar70 == 0) {
LAB_0018f39f:
                  pvVar43 = (void *)0x0;
LAB_0018f3a2:
                  points = (stbtt__point *)0x0;
                }
                else {
                  pvVar43 = ImGui::MemAlloc((long)(int)uVar70 << 2);
                  if (pvVar43 == (void *)0x0) {
                    uVar70 = 0;
                    goto LAB_0018f3a2;
                  }
                  uVar57 = 0;
                  iVar38 = 0;
                  points = (stbtt__point *)0x0;
                  pvStack_410 = pvVar43;
                  do {
                    auVar114 = auStack_488;
                    auStack_488._4_4_ = 0;
                    auStack_488._0_4_ = uVar57;
                    uVar40 = auStack_488._0_8_;
                    auStack_488 = auVar114;
                    if (uVar57 == 0) {
LAB_0018f1a9:
                      asStack_298[0].data =
                           (uchar *)((ulong)asStack_298[0].data & 0xffffffff00000000);
                      if ((int)uVar37 < 1) {
                        lVar51 = -1;
                      }
                      else {
                        auStack_488 = CONCAT88(auStack_488._8_8_,uVar40);
                        auVar101 = ZEXT1664(ZEXT816(0) << 0x40);
                        uVar57 = 0xffffffff;
                        lVar51 = 0;
                        do {
                          puVar44 = asStack_298[0].data;
                          switch(*(undefined1 *)(lVar64 + 0xc + lVar51)) {
                          case 1:
                            if (-1 < (int)uVar57) {
                              *(int *)((long)pvStack_410 + (ulong)uVar57 * 4) =
                                   (int)asStack_298[0].data - iVar38;
                            }
                            uVar57 = uVar57 + 1;
                            auVar114 = vpmovsxwd_avx(ZEXT416(*(uint *)(lVar64 + lVar51)));
                            auVar114 = vcvtdq2ps_avx(auVar114);
                            iVar38 = (int)asStack_298[0].data;
                            break;
                          case 2:
                            auVar114 = vpmovsxwd_avx(ZEXT416(*(uint *)(lVar64 + lVar51)));
                            auVar114 = vcvtdq2ps_avx(auVar114);
                            break;
                          case 3:
                            auVar114 = vmovshdup_avx(auVar101._0_16_);
                            stbtt__tesselate_curve
                                      (points,(int *)asStack_298,auVar101._0_4_,auVar114._0_4_,
                                       (float)(int)*(short *)(lVar64 + 4 + lVar51),
                                       (float)(int)*(short *)(lVar64 + 6 + lVar51),
                                       (float)(int)*(short *)(lVar64 + lVar51),
                                       (float)(int)*(short *)(lVar64 + 2 + lVar51),fStack_3d8,0);
                            goto LAB_0018f2ee;
                          case 4:
                            auVar114 = vmovshdup_avx(auVar101._0_16_);
                            in_ZMM8 = ZEXT464((uint)fStack_3d8);
                            stbtt__tesselate_cubic
                                      (points,(int *)asStack_298,auVar101._0_4_,auVar114._0_4_,
                                       (float)(int)*(short *)(lVar64 + 4 + lVar51),
                                       (float)(int)*(short *)(lVar64 + 6 + lVar51),
                                       (float)(int)*(short *)(lVar64 + 8 + lVar51),
                                       (float)(int)*(short *)(lVar64 + 10 + lVar51),
                                       (float)(int)*(short *)(lVar64 + lVar51),
                                       (float)(int)*(short *)(lVar64 + 2 + lVar51),fStack_3d8,0);
LAB_0018f2ee:
                            auVar114 = vpmovsxwd_avx(ZEXT416(*(uint *)(lVar64 + lVar51)));
                            auVar114 = vcvtdq2ps_avx(auVar114);
                            auVar101 = ZEXT1664(auVar114);
                            puVar44 = asStack_298[0].data;
                          default:
                            goto switchD_0018f1f2_default;
                          }
                          puVar44 = (uchar *)CONCAT44(asStack_298[0].data._4_4_,
                                                      (int)asStack_298[0].data + 1);
                          auVar101 = ZEXT1664(auVar114);
                          if (points != (stbtt__point *)0x0) {
                            sVar4 = (stbtt__point)vmovlps_avx(auVar114);
                            points[(int)asStack_298[0].data] = sVar4;
                          }
switchD_0018f1f2_default:
                          asStack_298[0].data = puVar44;
                          lVar51 = lVar51 + 0xe;
                        } while ((ulong)uVar37 * 0xe != lVar51);
                        lVar51 = (long)(int)uVar57;
                        uVar57 = auStack_488._0_4_;
                        pvVar43 = pvStack_410;
                      }
                      *(int *)((long)pvVar43 + lVar51 * 4) = (int)asStack_298[0].data - iVar38;
                      bVar29 = true;
                      uVar58 = uVar57;
                    }
                    else {
                      points = (stbtt__point *)ImGui::MemAlloc((long)(int)asStack_298[0].data << 3);
                      if (points != (stbtt__point *)0x0) goto LAB_0018f1a9;
                      points = (stbtt__point *)0x0;
                      bVar29 = false;
                      uVar58 = uVar57;
                    }
                    if (!bVar29) {
                      ImGui::MemFree(points);
                      ImGui::MemFree(pvVar43);
                      uVar70 = 0;
                      goto LAB_0018f39f;
                    }
                    uVar57 = uVar58 + 1;
                  } while (uVar58 == 0);
                }
                auVar114 = in_ZMM8._0_16_;
                if (points != (stbtt__point *)0x0) {
                  if ((int)uVar70 < 1) {
                    size = 0x14;
                  }
                  else {
                    lVar64 = (ulong)uVar70 - 1;
                    auVar92._8_8_ = lVar64;
                    auVar92._0_8_ = lVar64;
                    auVar92._16_8_ = lVar64;
                    auVar92._24_8_ = lVar64;
                    auVar101 = ZEXT1664((undefined1  [16])0x0);
                    uVar40 = 0;
                    auVar20 = vpmovsxbq_avx2(ZEXT416(0x3020100));
                    auVar21 = vpmovsxbq_avx2(ZEXT416(0x7060504));
                    auVar19 = vpcmpeqd_avx2(in_ZMM8._0_32_,in_ZMM8._0_32_);
                    auVar114 = auVar19._0_16_;
                    do {
                      auVar134._8_8_ = uVar40;
                      auVar134._0_8_ = uVar40;
                      auVar134._16_8_ = uVar40;
                      auVar134._24_8_ = uVar40;
                      auVar100 = vpor_avx2(auVar134,auVar20);
                      auVar143._8_8_ = 0x8000000000000000;
                      auVar143._0_8_ = 0x8000000000000000;
                      auVar143._16_8_ = 0x8000000000000000;
                      auVar143._24_8_ = 0x8000000000000000;
                      auVar134 = vpor_avx2(auVar134,auVar21);
                      auVar134 = vpcmpgtq_avx2(auVar134 ^ auVar143,auVar92 ^ auVar143);
                      auVar100 = vpcmpgtq_avx2(auVar100 ^ auVar143,auVar92 ^ auVar143);
                      auVar134 = vpackssdw_avx2(auVar100,auVar134);
                      auVar84 = vpackssdw_avx(SUB3216(auVar19 ^ auVar134,0),
                                              SUB3216(auVar19 ^ auVar134,0x10));
                      auVar84 = vpshufd_avx(auVar84,0xd8);
                      auVar100 = vpmovzxwd_avx2(auVar84);
                      auVar100 = vpslld_avx2(auVar100,0x1f);
                      auVar100 = vpmaskmovd_avx2(auVar100,*(undefined1 (*) [32])
                                                           ((long)pvVar43 + uVar40 * 4));
                      auVar143 = auVar101._0_32_;
                      auVar100 = vpaddd_avx2(auVar100,auVar143);
                      auVar101 = ZEXT3264(auVar100);
                      uVar40 = uVar40 + 8;
                    } while ((uVar70 + 7 & 0xfffffff8) != uVar40);
                    auVar19 = vpermq_avx2(auVar134,0xd8);
                    auVar19 = vblendvps_avx(auVar100,auVar143,auVar19);
                    auVar84 = vphaddd_avx(auVar19._16_16_,auVar19._0_16_);
                    auVar84 = vphaddd_avx(auVar84,auVar84);
                    auVar84 = vphaddd_avx(auVar84,auVar84);
                    size = (long)auVar84._0_4_ * 0x14 + 0x14;
                  }
                  in_ZMM8 = ZEXT1664(auVar114);
                  p = (stbtt__edge *)ImGui::MemAlloc(size);
                  psStack_3f0 = p;
                  if (p != (stbtt__edge *)0x0) {
                    if ((int)uVar70 < 1) {
                      uVar37 = 0;
                    }
                    else {
                      uVar40 = 0;
                      uVar37 = 0;
                      iVar38 = 0;
                      do {
                        iVar68 = *(int *)((long)pvVar43 + uVar40 * 4);
                        if (0 < iVar68) {
                          uVar63 = (ulong)(iVar68 - 1);
                          uVar49 = 0;
                          do {
                            iVar39 = (int)uVar63;
                            fVar93 = points[(long)iVar38 + (long)iVar39].y;
                            fVar75 = points[(long)iVar38 + uVar49].y;
                            if ((fVar93 != fVar75) || (NAN(fVar93) || NAN(fVar75))) {
                              iVar67 = (int)uVar49;
                              iVar48 = iVar39;
                              if (fVar93 <= fVar75) {
                                iVar48 = iVar67;
                                iVar67 = iVar39;
                              }
                              p[(int)uVar37].invert = (uint)(fVar75 < fVar93);
                              auVar81._8_8_ = 0;
                              auVar81._0_4_ = points[(long)iVar38 + (long)iVar48].x;
                              auVar81._4_4_ = points[(long)iVar38 + (long)iVar48].y;
                              auVar114 = vmovhps_avx(auVar81,points[(long)iVar38 + (long)iVar67]);
                              fVar76 = auVar114._0_4_ * (float)uStack_78 + 0.0;
                              fVar87 = auVar114._4_4_ * (float)((ulong)uStack_78 >> 0x20) + 0.0;
                              fVar88 = auVar114._8_4_ * (float)uStack_70 + 0.0;
                              fVar89 = auVar114._12_4_ * (float)((ulong)uStack_70 >> 0x20) + 0.0;
                              psVar1 = p + (int)uVar37;
                              psVar1->x0 = fVar76;
                              psVar1->y0 = fVar87;
                              psVar1->x1 = fVar88;
                              psVar1->y1 = fVar89;
                              uVar37 = uVar37 + 1;
                            }
                            uVar63 = uVar49 & 0xffffffff;
                            uVar49 = uVar49 + 1;
                          } while ((long)uVar49 < (long)*(int *)((long)pvVar43 + uVar40 * 4));
                        }
                        iVar38 = iVar38 + iVar68;
                        uVar40 = uVar40 + 1;
                      } while (uVar40 != uVar70);
                    }
                    pvStack_410 = pvVar43;
                    psStack_348 = points;
                    stbtt__sort_edges_quicksort(p,uVar37);
                    if (1 < (int)uVar37) {
                      uVar40 = 1;
                      do {
                        uVar2 = p[uVar40].x0;
                        uVar6 = p[uVar40].y0;
                        auVar82._4_4_ = uVar6;
                        auVar82._0_4_ = uVar2;
                        auVar82._8_8_ = 0;
                        auVar114 = vmovshdup_avx(auVar82);
                        iVar38 = p[uVar40].invert;
                        asStack_298[0].cursor = iVar38;
                        asStack_298[0].data = *(uchar **)&p[uVar40].x1;
                        uVar49 = uVar40 & 0xffffffff;
                        do {
                          uVar70 = (uint)uVar49;
                          if ((int)uVar70 < 1) break;
                          fVar93 = p[uVar49 - 1].y0;
                          if (auVar114._0_4_ < fVar93) {
                            psVar1 = p + uVar49;
                            psVar1->invert = psVar1[-1].invert;
                            fVar75 = psVar1[-1].y0;
                            fVar105 = psVar1[-1].x1;
                            fVar109 = psVar1[-1].y1;
                            psVar1->x0 = psVar1[-1].x0;
                            psVar1->y0 = fVar75;
                            psVar1->x1 = fVar105;
                            psVar1->y1 = fVar109;
                            uVar49 = (ulong)(uVar70 - 1);
                          }
                          uVar70 = (uint)uVar49;
                        } while (auVar114._0_4_ < fVar93);
                        if (uVar40 != uVar70) {
                          uVar5 = vmovlps_avx(auVar82);
                          p[(int)uVar70].x0 = (float)(int)uVar5;
                          p[(int)uVar70].y0 = (float)(int)((ulong)uVar5 >> 0x20);
                          *(uchar **)&p[(int)uVar70].x1 = asStack_298[0].data;
                          p[(int)uVar70].invert = iVar38;
                        }
                        uVar40 = uVar40 + 1;
                      } while (uVar40 != uVar37);
                    }
                    uVar70 = (int)uStack_418 - (int)uStack_470;
                    uStack_418 = (ulong)uVar70;
                    auStack_4b0 = (undefined1  [8])0x0;
                    scanline = asStack_298;
                    if (0x3f < (int)uVar70) {
                      scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)uStack_3fc * 8 + 4);
                      p = psStack_3f0;
                    }
                    uVar70 = (int)uStack_3c8 - (int)puStack_3e8;
                    uStack_3c8 = (ulong)uVar70;
                    p[(int)uVar37].y0 = (float)((int)uStack_498 + iStack_3dc) + 1.0;
                    if (uVar70 < 0x7fffffff) {
                      puStack_3b0 = puStack_3c0 + (long)puStack_3b0 * lVar69 + auStack_468._0_8_;
                      fStack_378 = (float)(int)auStack_448._0_4_;
                      psVar53 = (stbtt__active_edge *)(ulong)uStack_3fc;
                      lStack_2d8 = (long)(int)uStack_3fc;
                      pfStack_398 = (float *)((long)&scanline->data + lStack_2d8 * 4);
                      pfStack_340 = pfStack_398 + 1;
                      sStack_2c8 = lStack_2d8 * 4;
                      fStack_400 = (float)(int)uStack_3fc;
                      sStack_2d0 = (long)(int)(uint)uStack_418 * 4 + 8;
                      psStack_3a8 = (stbtt__active_edge *)0x0;
                      uStack_3a0 = 0;
                      psStack_3f8 = (stbtt__active_edge *)0x0;
                      uStack_3d4 = 0;
                      psVar72 = (stbtt__active_edge *)0x0;
                      iVar38 = iStack_3dc;
                      do {
                        fVar75 = (float)iVar38;
                        fVar93 = fVar75 + 1.0;
                        iStack_37c = iVar38;
                        memset(scanline,0,sStack_2c8);
                        memset(pfStack_398,0,sStack_2d0);
                        if (auStack_4b0 != (undefined1  [8])0x0) {
                          auVar46 = auStack_4b0;
                          psVar47 = (stbtt__active_edge *)auStack_4b0;
                          do {
                            psVar53 = (stbtt__active_edge *)auVar46;
                            if (((stbtt__active_edge *)auVar46)->ey <= fVar75) {
                              psVar47->next = ((stbtt__active_edge *)auVar46)->next;
                              if ((((stbtt__active_edge *)auVar46)->direction == 0.0) &&
                                 (!NAN(((stbtt__active_edge *)auVar46)->direction))) {
                                __assert_fail("z->direction",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                                              ,0xc63,
                                              "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                             );
                              }
                              ((stbtt__active_edge *)auVar46)->direction = 0.0;
                              ((stbtt__active_edge *)auVar46)->next = psVar72;
                              psVar53 = psVar47;
                              psVar72 = (stbtt__active_edge *)auVar46;
                            }
                            auVar46 = (undefined1  [8])psVar53->next;
                            psVar47 = psVar53;
                          } while (auVar46 != (undefined1  [8])0x0);
                        }
                        fVar105 = p->y0;
                        auVar46 = auStack_4b0;
                        if (fVar105 <= fVar93) {
                          bVar29 = iStack_3dc != 0;
                          bVar74 = (int)uStack_3a0 == 0;
                          do {
                            if ((fVar105 != p->y1) || (NAN(fVar105) || NAN(p->y1))) {
                              if (psVar72 == (stbtt__active_edge *)0x0) {
                                psVar53 = (stbtt__active_edge *)(ulong)uStack_3d4;
                                if (uStack_3d4 == 0) {
                                  psVar47 = (stbtt__active_edge *)ImGui::MemAlloc(0x6408);
                                  if (psVar47 == (stbtt__active_edge *)0x0) {
                                    psVar47 = (stbtt__active_edge *)0x0;
                                    goto LAB_0018ff83;
                                  }
                                  psVar47->next = psStack_3f8;
                                  uStack_3d4 = 800;
                                  psStack_3f8 = psVar47;
                                }
                                lVar64 = (long)(int)uStack_3d4;
                                uStack_3d4 = uStack_3d4 - 1;
                                psVar47 = (stbtt__active_edge *)&psStack_3f8[lVar64 + -1].fx;
                                psVar53 = psStack_3f8;
                              }
                              else {
                                psVar47 = psVar72;
                                psVar72 = psVar72->next;
                              }
LAB_0018ff83:
                              if (psVar47 == (stbtt__active_edge *)0x0) {
                                __assert_fail("z != __null",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                                              ,0xad1,
                                              "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                             );
                              }
                              fVar105 = p->x0;
                              fVar109 = p->y0;
                              fVar110 = p->y1;
                              auVar83._0_4_ = (p->x1 - fVar105) / (fVar110 - fVar109);
                              auVar83._4_12_ = SUB6012((undefined1  [60])0x0,0);
                              psVar47->fdx = auVar83._0_4_;
                              auVar84 = vcmpss_avx(auVar83,ZEXT416(0),4);
                              auVar102._0_4_ = 1.0 / auVar83._0_4_;
                              auVar102._4_12_ = SUB6012((undefined1  [60])0x0,0);
                              auVar114 = vblendps_avx(auVar102,_DAT_001ea7f0,0xe);
                              psVar47->fx = (auVar83._0_4_ * (fVar75 - fVar109) + fVar105) -
                                            fStack_378;
                              psVar53 = (stbtt__active_edge *)
                                        CONCAT71((int7)((ulong)psVar53 >> 8),p->invert == 0);
                              auVar84 = vpinsrb_avx(ZEXT416(auVar84._0_4_),(int)psVar53,4);
                              auVar84 = vpslld_avx(auVar84,0x1f);
                              auVar114 = vblendvps_avx(ZEXT816(0x3f80000000000000),auVar114,auVar84)
                              ;
                              uVar5 = vmovlps_avx(auVar114);
                              psVar47->fdy = (float)(int)uVar5;
                              psVar47->direction = (float)(int)((ulong)uVar5 >> 0x20);
                              psVar47->sy = fVar109;
                              psVar47->ey = fVar110;
                              psVar47->next = (stbtt__active_edge *)0x0;
                              if (fVar110 < fVar75 && (bVar74 && bVar29)) {
                                psVar47->ey = fVar75;
                              }
                              if (psVar47->ey < fVar75) {
                                __assert_fail("z->ey >= scan_y_top",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                                              ,0xc76,
                                              "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                             );
                              }
                              psVar47->next = (stbtt__active_edge *)auStack_4b0;
                              auStack_4b0 = (undefined1  [8])psVar47;
                            }
                            fVar105 = p[1].y0;
                            p = p + 1;
                            auVar46 = auStack_4b0;
                          } while (fVar105 <= fVar93);
                        }
                        for (; auVar46 != (undefined1  [8])0x0;
                            auVar46 = (undefined1  [8])((stbtt__active_edge *)auVar46)->next) {
                          fVar105 = ((stbtt__active_edge *)auVar46)->ey;
                          if (fVar105 < fVar75) {
                            __assert_fail("e->ey >= y_top",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                                          ,0xba5,
                                          "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                         );
                          }
                          fVar109 = ((stbtt__active_edge *)auVar46)->fx;
                          auVar101 = ZEXT464((uint)fVar109);
                          fVar110 = ((stbtt__active_edge *)auVar46)->fdx;
                          auVar114 = ZEXT416((uint)fVar109);
                          if ((fVar110 != 0.0) || (NAN(fVar110))) {
                            fVar95 = ((stbtt__active_edge *)auVar46)->sy;
                            if (fVar93 < fVar95) {
                              __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                                            ,3000,
                                            "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                           );
                            }
                            fVar94 = fVar110 + fVar109;
                            in_ZMM8 = ZEXT464((uint)fVar94);
                            auVar84 = vcmpss_avx(ZEXT416((uint)fVar75),ZEXT416((uint)fVar95),1);
                            auVar84 = vblendvps_avx(auVar114,ZEXT416((uint)(fVar110 * (fVar95 - 
                                                  fVar75) + fVar109)),auVar84);
                            fVar104 = auVar84._0_4_;
                            if (0.0 <= fVar104) {
                              auVar90 = vcmpss_avx(ZEXT416((uint)fVar105),ZEXT416((uint)fVar93),1);
                              auVar90 = vblendvps_avx(ZEXT416((uint)fVar94),
                                                      ZEXT416((uint)(fVar110 * (fVar105 - fVar75) +
                                                                    fVar109)),auVar90);
                              fVar111 = auVar90._0_4_;
                              if (((0.0 <= fVar111) && (fVar104 < fStack_400)) &&
                                 (fVar111 < fStack_400)) {
                                auVar114 = vmaxss_avx(ZEXT416((uint)fVar95),ZEXT416((uint)fVar75));
                                uVar37 = (uint)fVar104;
                                auVar17 = vminss_avx(ZEXT416((uint)fVar105),ZEXT416((uint)fVar93));
                                fVar110 = auVar114._0_4_;
                                fVar105 = auVar17._0_4_;
                                if (uVar37 == (int)fVar111) {
                                  if (((int)uVar37 < 0) || ((int)(uint)uStack_418 < (int)uVar37)) {
                                    __assert_fail("x >= 0 && x < len",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                                                  ,0xbd4,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                 );
                                  }
                                  uVar40 = (ulong)uVar37;
                                  *(float *)((long)&scanline->data + uVar40 * 4) =
                                       (((fVar104 - (float)(int)uVar37) +
                                        (fVar111 - (float)(int)uVar37)) * -0.5 + 1.0) *
                                       ((stbtt__active_edge *)auVar46)->direction *
                                       (fVar105 - fVar110) +
                                       *(float *)((long)&scanline->data + uVar40 * 4);
                                  fVar109 = (fVar105 - fVar110) *
                                            ((stbtt__active_edge *)auVar46)->direction;
                                }
                                else {
                                  fVar95 = ((stbtt__active_edge *)auVar46)->fdy;
                                  auVar114 = auVar84;
                                  if (fVar111 < fVar104) {
                                    fVar109 = fVar75 - fVar105;
                                    fVar105 = fVar93 + (fVar75 - fVar110);
                                    fVar110 = fVar93 + fVar109;
                                    fVar95 = (float)((uint)fVar95 ^ auStack_318._0_4_);
                                    auVar114 = auVar90;
                                    auVar90 = auVar84;
                                    fVar109 = fVar94;
                                  }
                                  fVar111 = auVar114._0_4_;
                                  iVar68 = (int)auVar90._0_4_;
                                  iVar38 = (int)fVar111 + 1;
                                  fVar94 = ((float)iVar38 - fVar109) * fVar95 + fVar75;
                                  fVar109 = ((stbtt__active_edge *)auVar46)->direction;
                                  fVar104 = fVar109 * (fVar94 - fVar110);
                                  auVar133._0_4_ = (int)fVar111;
                                  auVar133._4_4_ = (int)auVar114._4_4_;
                                  auVar133._8_4_ = (int)auVar114._8_4_;
                                  auVar133._12_4_ = (int)auVar114._12_4_;
                                  auVar114 = vcvtdq2ps_avx(auVar133);
                                  lVar64 = (long)(int)fVar111;
                                  *(float *)((long)&scanline->data + lVar64 * 4) =
                                       fVar104 * (((fVar111 - auVar114._0_4_) + 1.0) * -0.5 + 1.0) +
                                       *(float *)((long)&scanline->data + lVar64 * 4);
                                  if (iVar68 - iVar38 != 0 && iVar38 <= iVar68) {
                                    do {
                                      *(float *)((long)&scanline->data + lVar64 * 4 + 4) =
                                           fVar95 * fVar109 * 0.5 + fVar104 +
                                           *(float *)((long)&scanline->data + lVar64 * 4 + 4);
                                      fVar104 = fVar95 * fVar109 + fVar104;
                                      lVar64 = lVar64 + 1;
                                    } while (iVar68 + -1 != (int)lVar64);
                                  }
                                  auVar98._8_4_ = 0x7fffffff;
                                  auVar98._0_8_ = 0x7fffffff7fffffff;
                                  auVar98._12_4_ = 0x7fffffff;
                                  auVar114 = vandps_avx(ZEXT416((uint)fVar104),auVar98);
                                  in_ZMM8 = ZEXT464(0x3f8147ae);
                                  if (1.01 < auVar114._0_4_) {
                                    __assert_fail("fabsf(area) <= 1.01f",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                                                  ,0xbfb,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                 );
                                  }
                                  uVar40 = (ulong)iVar68;
                                  *(float *)((long)&scanline->data + uVar40 * 4) =
                                       fVar109 * (((auVar90._0_4_ - (float)iVar68) + 0.0) * -0.5 +
                                                 1.0) *
                                       (fVar105 - (fVar95 * (float)(iVar68 - iVar38) + fVar94)) +
                                       fVar104 + *(float *)((long)&scanline->data + uVar40 * 4);
                                  fVar109 = fVar109 * (fVar105 - fVar110);
                                }
                                pfStack_340[uVar40] = fVar109 + pfStack_340[uVar40];
                                goto LAB_0018fe0a;
                              }
                            }
                            if ((uint)uStack_418 < 0x7fffffff) {
                              sStack_390 = CONCAT44(sStack_390._4_4_,fVar110);
                              auStack_448 = ZEXT416((uint)fVar94);
                              auStack_368 = auVar114;
                              uVar37 = 0;
                              fVar105 = uStack_498;
                              do {
                                fVar104 = (float)(int)uVar37;
                                uVar70 = uVar37 + 1;
                                fVar94 = (float)(int)uVar70;
                                fVar95 = auVar101._0_4_;
                                fVar109 = (fVar104 - fVar95) / fVar110 + fVar75;
                                uStack_498 = (fVar94 - fVar95) / fVar110 + fVar75;
                                auStack_488._0_4_ = fVar104;
                                fVar110 = in_ZMM8._0_4_;
                                if ((fVar104 <= fVar95) || (fVar110 <= fVar94)) {
                                  if ((fVar104 <= fVar110) || (fVar95 <= fVar94)) {
                                    fVar111 = fVar75;
                                    if (((fVar104 <= fVar95) || (fVar110 <= fVar104)) &&
                                       ((fVar104 <= fVar110 || (fVar95 <= fVar104)))) {
                                      if (((fVar95 < fVar94) && (fVar94 < fVar110)) ||
                                         ((fVar110 < fVar94 && (fVar94 < fVar95)))) {
                                        auStack_468._0_4_ = fVar94;
                                        fVar109 = fVar75;
                                        goto LAB_0018fad4;
                                      }
                                      fVar109 = fVar75;
                                      auVar114 = in_ZMM8._0_16_;
                                      uStack_498 = fVar105;
                                      goto LAB_0018fba1;
                                    }
                                  }
                                  else {
                                    auStack_468._0_4_ = fVar94;
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,uVar37,
                                               (stbtt__active_edge *)auVar46,fVar95,fVar75,fVar94,
                                               uStack_498);
                                    fVar111 = uStack_498;
                                    fVar95 = (float)auStack_468._0_4_;
                                    fVar104 = (float)auStack_488._0_4_;
                                    fVar105 = uStack_498;
                                  }
                                  uStack_498 = fVar105;
                                  stbtt__handle_clipped_edge
                                            ((float *)scanline,uVar37,(stbtt__active_edge *)auVar46,
                                             fVar95,fVar111,fVar104,fVar109);
                                  auVar114 = auStack_448;
                                  fVar95 = (float)auStack_488._0_4_;
                                }
                                else {
                                  auStack_468._0_4_ = fVar94;
                                  stbtt__handle_clipped_edge
                                            ((float *)scanline,uVar37,(stbtt__active_edge *)auVar46,
                                             fVar95,fVar75,fVar104,fVar109);
                                  fVar95 = (float)auStack_488._0_4_;
                                  fVar94 = (float)auStack_468._0_4_;
LAB_0018fad4:
                                  stbtt__handle_clipped_edge
                                            ((float *)scanline,uVar37,(stbtt__active_edge *)auVar46,
                                             fVar95,fVar109,fVar94,uStack_498);
                                  fVar109 = uStack_498;
                                  auVar114 = auStack_448;
                                  fVar95 = (float)auStack_468._0_4_;
                                }
LAB_0018fba1:
                                stbtt__handle_clipped_edge
                                          ((float *)scanline,uVar37,(stbtt__active_edge *)auVar46,
                                           fVar95,fVar109,auVar114._0_4_,fVar93);
                                auVar101 = ZEXT1664(auStack_368);
                                in_ZMM8 = ZEXT1664(auStack_448);
                                fVar110 = (float)sStack_390;
                                uVar37 = uVar70;
                                fVar105 = uStack_498;
                              } while (uStack_3fc != uVar70);
                            }
                          }
                          else if (fVar109 < fStack_400) {
                            if (0.0 <= fVar109) {
                              auStack_368 = auVar114;
                              stbtt__handle_clipped_edge
                                        ((float *)scanline,(int)fVar109,
                                         (stbtt__active_edge *)auVar46,fVar109,fVar75,fVar109,fVar93
                                        );
                              iVar38 = (int)fVar109 + 1;
                              auVar114 = auStack_368;
                            }
                            else {
                              iVar38 = 0;
                            }
                            stbtt__handle_clipped_edge
                                      (pfStack_398,iVar38,(stbtt__active_edge *)auVar46,
                                       auVar114._0_4_,fVar75,auVar114._0_4_,fVar93);
                          }
LAB_0018fe0a:
                        }
                        auVar46 = auStack_4b0;
                        if ((uint)uStack_418 < 0x7fffffff) {
                          auVar101 = ZEXT1664(ZEXT816(0) << 0x40);
                          psVar45 = scanline;
                          psVar47 = psStack_3a8;
                          lVar64 = lStack_2d8;
                          do {
                            fVar93 = auVar101._0_4_ +
                                     *(float *)((long)&psVar45->data + lStack_2d8 * 4);
                            auVar101 = ZEXT464((uint)fVar93);
                            auVar96._8_4_ = 0x7fffffff;
                            auVar96._0_8_ = 0x7fffffff7fffffff;
                            auVar96._12_4_ = 0x7fffffff;
                            auVar114 = vandps_avx(ZEXT416((uint)(fVar93 + *(float *)&psVar45->data))
                                                  ,auVar96);
                            iVar38 = (int)(auVar114._0_4_ * 255.0 + 0.5);
                            uVar62 = (uchar)iVar38;
                            if (0xfe < iVar38) {
                              uVar62 = 0xff;
                            }
                            puStack_3b0[(int)psVar47] = uVar62;
                            psVar47 = (stbtt__active_edge *)(ulong)((int)psVar47 + 1);
                            psVar45 = (stbtt__buf *)((long)&psVar45->data + 4);
                            lVar64 = lVar64 + -1;
                          } while (lVar64 != 0);
                        }
                        for (; auVar46 != (undefined1  [8])0x0;
                            auVar46 = (undefined1  [8])((stbtt__active_edge *)auVar46)->next) {
                          ((stbtt__active_edge *)auVar46)->fx =
                               ((stbtt__active_edge *)auVar46)->fdx +
                               ((stbtt__active_edge *)auVar46)->fx;
                        }
                        iVar38 = iStack_37c + 1;
                        iVar68 = (int)uStack_3a0;
                        uStack_3a0 = (ulong)(iVar68 + 1);
                        psVar53 = (stbtt__active_edge *)(ulong)(uint)((int)psStack_3a8 + iStack_380)
                        ;
                        psStack_3a8 = psVar53;
                        pvVar14 = pvStack_410;
                        psVar47 = psStack_3f8;
                        psVar27 = psStack_348;
                      } while (iVar68 != (int)uStack_3c8);
                    }
                    else {
                      psStack_3f8 = (stbtt__active_edge *)0x0;
                      pvVar14 = pvStack_410;
                      psVar47 = psStack_3f8;
                      psVar27 = psStack_348;
                    }
                    while (points = psStack_348, pvVar43 = pvStack_410, pvStack_410 = pvVar14,
                          psStack_348 = psVar27, psVar47 != (stbtt__active_edge *)0x0) {
                      psVar53 = psVar47->next;
                      ImGui::MemFree(psVar47);
                      pvVar14 = pvStack_410;
                      psVar47 = psVar53;
                      psVar27 = psStack_348;
                      psStack_348 = points;
                      pvStack_410 = pvVar43;
                    }
                    if (scanline != asStack_298) {
                      ImGui::MemFree(scanline);
                    }
                    ImGui::MemFree(psStack_3f0);
                  }
                  ImGui::MemFree(pvVar43);
                  ImGui::MemFree(points);
                }
              }
              ImGui::MemFree((void *)CONCAT44(uStack_408._4_4_,(stbtt_uint32)uStack_408));
              if (1 < (byte)uStack_330) {
                uVar30 = *(ushort *)(lStack_3b8 + 4);
                uVar11 = *(ushort *)(lStack_3b8 + 6);
                asStack_298[0].data = (uchar *)0x0;
                if (uVar11 != 0) {
                  puVar44 = puStack_3c0 +
                            (ulong)*(ushort *)(lStack_3b8 + 10) * lVar69 +
                            (ulong)*(ushort *)(lStack_3b8 + 8);
                  iVar38 = (uint)uVar30 - (int)uStack_470;
                  uVar40 = (ulong)(iVar38 + 1);
                  uVar37 = 0;
                  do {
                    uVar49 = uStack_330;
                    memset(asStack_298,0,uStack_330);
                    switch((int)uVar49) {
                    case 2:
                      if (iVar38 < 0) {
LAB_001902e8:
                        uVar63 = 0;
                        uVar49 = 0;
                      }
                      else {
                        uVar63 = 0;
                        uVar49 = 0;
                        do {
                          bVar8 = puVar44[uVar63];
                          bVar9 = *(byte *)((long)&asStack_298[0].data + (ulong)((uint)uVar63 & 7));
                          *(byte *)((long)&asStack_298[0].data + (ulong)((uint)uVar63 + 2 & 7)) =
                               bVar8;
                          uVar70 = (int)uVar49 + ((uint)bVar8 - (uint)bVar9);
                          uVar49 = (ulong)uVar70;
                          puVar44[uVar63] = (uchar)(uVar70 >> 1);
                          uVar63 = uVar63 + 1;
                        } while (uVar40 != uVar63);
                      }
                      break;
                    case 3:
                      if (iVar38 < 0) goto LAB_001902e8;
                      uVar63 = 0;
                      uVar49 = 0;
                      do {
                        bVar8 = puVar44[uVar63];
                        bVar9 = *(byte *)((long)&asStack_298[0].data + (ulong)((uint)uVar63 & 7));
                        *(byte *)((long)&asStack_298[0].data + (ulong)((uint)uVar63 + 3 & 7)) =
                             bVar8;
                        uVar49 = (ulong)((int)uVar49 + ((uint)bVar8 - (uint)bVar9));
                        puVar44[uVar63] = (uchar)(uVar49 / 3);
                        uVar63 = uVar63 + 1;
                      } while (uVar40 != uVar63);
                      break;
                    case 4:
                      if (iVar38 < 0) goto LAB_001902e8;
                      uVar63 = 0;
                      uVar49 = 0;
                      do {
                        bVar8 = puVar44[uVar63];
                        uVar56 = (ulong)((uint)uVar63 & 7);
                        bVar9 = *(byte *)((long)&asStack_298[0].data + uVar56);
                        *(byte *)((long)&asStack_298[0].data + (uVar56 ^ 4)) = bVar8;
                        uVar70 = (int)uVar49 + ((uint)bVar8 - (uint)bVar9);
                        uVar49 = (ulong)uVar70;
                        puVar44[uVar63] = (uchar)(uVar70 >> 2);
                        uVar63 = uVar63 + 1;
                      } while (uVar40 != uVar63);
                      break;
                    case 5:
                      if (iVar38 < 0) goto LAB_001902e8;
                      uVar63 = 0;
                      uVar49 = 0;
                      do {
                        bVar8 = puVar44[uVar63];
                        bVar9 = *(byte *)((long)&asStack_298[0].data + (ulong)((uint)uVar63 & 7));
                        *(byte *)((long)&asStack_298[0].data + (ulong)((uint)uVar63 + 5 & 7)) =
                             bVar8;
                        uVar49 = (ulong)((int)uVar49 + ((uint)bVar8 - (uint)bVar9));
                        puVar44[uVar63] = (uchar)(uVar49 / 5);
                        uVar63 = uVar63 + 1;
                      } while (uVar40 != uVar63);
                      break;
                    default:
                      uVar63 = 0;
                      uVar49 = 0;
                      if (-1 < iVar38) {
                        do {
                          bVar8 = puVar44[uVar63];
                          bVar9 = *(byte *)((long)&asStack_298[0].data + (ulong)((uint)uVar63 & 7));
                          *(byte *)((long)&asStack_298[0].data +
                                   (ulong)((int)uStack_470 + (uint)uVar63 & 7)) = bVar8;
                          uVar49 = (ulong)((int)uVar49 + ((uint)bVar8 - (uint)bVar9));
                          puVar44[uVar63] = (uchar)(uVar49 / (uStack_470 & 0xffffffff));
                          uVar63 = uVar63 + 1;
                        } while (uVar40 != uVar63);
                      }
                    }
                    if ((int)uVar63 < (int)(uint)uVar30) {
                      uVar63 = uVar63 & 0xffffffff;
                      do {
                        if (puVar44[uVar63] != '\0') {
                          __assert_fail("pixels[i] == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                                        ,0xf41,
                                        "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)"
                                       );
                        }
                        uVar49 = (ulong)((int)uVar49 -
                                        (uint)*(byte *)((long)&asStack_298[0].data +
                                                       (ulong)((uint)uVar63 & 7)));
                        puVar44[uVar63] = (uchar)(uVar49 / (uStack_470 & 0xffffffff));
                        uVar63 = uVar63 + 1;
                      } while ((int)uVar63 < (int)(uint)uVar30);
                    }
                    puVar44 = puVar44 + lVar69;
                    uVar37 = uVar37 + 1;
                  } while (uVar37 != uVar11);
                }
              }
              if (1 < (byte)uStack_338) {
                uVar30 = *(ushort *)(lStack_3b8 + 4);
                uVar37 = (uint)*(ushort *)(lStack_3b8 + 6);
                asStack_298[0].data = (uchar *)0x0;
                if (uVar30 != 0) {
                  pbVar60 = puStack_3c0 +
                            (ulong)*(ushort *)(lStack_3b8 + 10) * lVar69 +
                            (ulong)*(ushort *)(lStack_3b8 + 8);
                  iVar38 = uVar37 - (int)puStack_3e8;
                  uVar40 = (ulong)(iVar38 + 1);
                  uVar70 = 0;
                  do {
                    uVar49 = uStack_338;
                    memset(asStack_298,0,uStack_338);
                    switch((int)uVar49) {
                    case 2:
                      if (iVar38 < 0) {
LAB_001905c3:
                        uVar63 = 0;
                        uVar49 = 0;
                      }
                      else {
                        uVar63 = 0;
                        uVar49 = 0;
                        pbVar65 = pbVar60;
                        do {
                          bVar8 = *pbVar65;
                          bVar9 = *(byte *)((long)&asStack_298[0].data + (ulong)((uint)uVar63 & 7));
                          *(byte *)((long)&asStack_298[0].data + (ulong)((uint)uVar63 + 2 & 7)) =
                               bVar8;
                          uVar57 = (int)uVar49 + ((uint)bVar8 - (uint)bVar9);
                          uVar49 = (ulong)uVar57;
                          *pbVar65 = (byte)(uVar57 >> 1);
                          uVar63 = uVar63 + 1;
                          pbVar65 = pbVar65 + lVar69;
                        } while (uVar40 != uVar63);
                      }
                      break;
                    case 3:
                      if (iVar38 < 0) goto LAB_001905c3;
                      uVar63 = 0;
                      uVar49 = 0;
                      pbVar65 = pbVar60;
                      do {
                        bVar8 = *pbVar65;
                        bVar9 = *(byte *)((long)&asStack_298[0].data + (ulong)((uint)uVar63 & 7));
                        *(byte *)((long)&asStack_298[0].data + (ulong)((uint)uVar63 + 3 & 7)) =
                             bVar8;
                        uVar49 = (ulong)((int)uVar49 + ((uint)bVar8 - (uint)bVar9));
                        *pbVar65 = (byte)(uVar49 / 3);
                        uVar63 = uVar63 + 1;
                        pbVar65 = pbVar65 + lVar69;
                      } while (uVar40 != uVar63);
                      break;
                    case 4:
                      if (iVar38 < 0) goto LAB_001905c3;
                      uVar63 = 0;
                      uVar49 = 0;
                      pbVar65 = pbVar60;
                      do {
                        bVar8 = *pbVar65;
                        uVar56 = (ulong)((uint)uVar63 & 7);
                        bVar9 = *(byte *)((long)&asStack_298[0].data + uVar56);
                        *(byte *)((long)&asStack_298[0].data + (uVar56 ^ 4)) = bVar8;
                        uVar57 = (int)uVar49 + ((uint)bVar8 - (uint)bVar9);
                        uVar49 = (ulong)uVar57;
                        *pbVar65 = (byte)(uVar57 >> 2);
                        uVar63 = uVar63 + 1;
                        pbVar65 = pbVar65 + lVar69;
                      } while (uVar40 != uVar63);
                      break;
                    case 5:
                      if (iVar38 < 0) goto LAB_001905c3;
                      uVar63 = 0;
                      uVar49 = 0;
                      pbVar65 = pbVar60;
                      do {
                        bVar8 = *pbVar65;
                        bVar9 = *(byte *)((long)&asStack_298[0].data + (ulong)((uint)uVar63 & 7));
                        *(byte *)((long)&asStack_298[0].data + (ulong)((uint)uVar63 + 5 & 7)) =
                             bVar8;
                        uVar49 = (ulong)((int)uVar49 + ((uint)bVar8 - (uint)bVar9));
                        *pbVar65 = (byte)(uVar49 / 5);
                        uVar63 = uVar63 + 1;
                        pbVar65 = pbVar65 + lVar69;
                      } while (uVar40 != uVar63);
                      break;
                    default:
                      if (iVar38 < 0) goto LAB_001905c3;
                      uVar63 = 0;
                      uVar49 = 0;
                      pbVar65 = pbVar60;
                      do {
                        bVar8 = *pbVar65;
                        bVar9 = *(byte *)((long)&asStack_298[0].data + (ulong)((uint)uVar63 & 7));
                        *(byte *)((long)&asStack_298[0].data +
                                 (ulong)((uint)puStack_3e8 + (uint)uVar63 & 7)) = bVar8;
                        uVar49 = (ulong)((int)uVar49 + ((uint)bVar8 - (uint)bVar9));
                        *pbVar65 = (byte)(uVar49 / ((ulong)puStack_3e8 & 0xffffffff));
                        uVar63 = uVar63 + 1;
                        pbVar65 = pbVar65 + lVar69;
                      } while (uVar40 != uVar63);
                    }
                    iVar68 = (int)uVar63;
                    iVar39 = uVar37 - iVar68;
                    if (iVar39 != 0 && iVar68 <= (int)uVar37) {
                      lVar64 = (long)iVar68;
                      pbVar65 = pbVar60 + lVar69 * lVar64;
                      do {
                        if (*pbVar65 != 0) {
                          __assert_fail("pixels[i*stride_in_bytes] == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                                        ,0xf7f,
                                        "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)"
                                       );
                        }
                        uVar57 = (int)uVar49 -
                                 (uint)*(byte *)((long)&asStack_298[0].data +
                                                (ulong)((uint)lVar64 & 7));
                        uVar49 = (ulong)uVar57;
                        *pbVar65 = (byte)(uVar57 / (uint)puStack_3e8);
                        lVar64 = lVar64 + 1;
                        pbVar65 = pbVar65 + lVar69;
                        iVar39 = iVar39 + -1;
                      } while (iVar39 != 0);
                    }
                    pbVar60 = pbVar60 + 1;
                    uVar70 = uVar70 + 1;
                  } while (uVar70 != uVar30);
                }
              }
              puStack_2e8[4] =
                   (uint)((float)(int)(short)((short)(uStack_384 << 8) + (short)uStack_388) *
                         fStack_328);
              auVar84 = vpinsrd_avx(ZEXT416(uStack_370),iStack_374,1);
              auVar114 = vcvtdq2ps_avx(auVar84);
              auVar101 = ZEXT1664(auStack_48);
              auVar91._0_4_ = auVar114._0_4_ * auStack_48._0_4_ + auStack_58._0_4_;
              auVar91._4_4_ = auVar114._4_4_ * auStack_48._4_4_ + auStack_58._4_4_;
              auVar91._8_4_ = auVar114._8_4_ * auStack_48._8_4_ + auStack_58._8_4_;
              auVar91._12_4_ = auVar114._12_4_ * auStack_48._12_4_ + auStack_58._12_4_;
              uVar5 = vmovlps_avx(auVar91);
              *(undefined8 *)(puStack_2e8 + 2) = uVar5;
              uVar37 = *(uint *)(lStack_3b8 + 8);
              *puStack_2e8 = uVar37;
              uVar70 = *(uint *)(lStack_3b8 + 4);
              auVar114 = vpaddw_avx(ZEXT416(uVar70),ZEXT416(uVar37));
              puStack_2e8[1] = auVar114._0_4_;
              auVar114 = vpmovzxwd_avx(ZEXT416(uVar70));
              auVar114 = vpaddd_avx(auVar84,auVar114);
              auVar114 = vcvtdq2ps_avx(auVar114);
              auVar85._0_4_ = auVar114._0_4_ * auStack_48._0_4_ + auStack_58._0_4_;
              auVar85._4_4_ = auVar114._4_4_ * auStack_48._4_4_ + auStack_58._4_4_;
              auVar85._8_4_ = auVar114._8_4_ * auStack_48._8_4_ + auStack_58._8_4_;
              auVar85._12_4_ = auVar114._12_4_ * auStack_48._12_4_ + auStack_58._12_4_;
              uVar5 = vmovlps_avx(auVar85);
              *(undefined8 *)(puStack_2e8 + 5) = uVar5;
              lVar64 = lStack_2f0;
              puVar52 = puStack_2e8;
              psVar71 = psStack_350;
              lVar51 = lStack_2e0;
              pIVar73 = pIStack_4b8;
            }
            lVar51 = lVar51 + 1;
          } while (lVar51 < psVar71[1].fontstart);
        }
        fVar93 = pIStack_2f8[lStack_3d0].RasterizerMultiply;
        if ((fVar93 != 1.0) || (NAN(fVar93))) {
          lVar64 = 0;
          auVar19 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
          auVar20 = vpmovsxbd_avx2(ZEXT816(0xf0e0d0c0b0a0908));
          auVar21 = vpmovsxbd_avx2(ZEXT816(0x1716151413121110));
          auVar92 = vpmovsxbd_avx2(ZEXT816(0x1f1e1d1c1b1a1918));
          auVar100._8_4_ = 0x53000080;
          auVar100._0_8_ = 0x5300008053000080;
          auVar100._12_4_ = 0x53000080;
          auVar100._16_4_ = 0x53000080;
          auVar100._20_4_ = 0x53000080;
          auVar100._24_4_ = 0x53000080;
          auVar100._28_4_ = 0x53000080;
          auVar152._8_4_ = 0x4f000000;
          auVar152._0_8_ = 0x4f0000004f000000;
          auVar152._12_4_ = 0x4f000000;
          auVar152._16_4_ = 0x4f000000;
          auVar152._20_4_ = 0x4f000000;
          auVar152._24_4_ = 0x4f000000;
          auVar152._28_4_ = 0x4f000000;
          do {
            auVar107._8_4_ = 0x4b000000;
            auVar107._0_8_ = 0x4b0000004b000000;
            auVar107._12_4_ = 0x4b000000;
            auVar107._16_4_ = 0x4b000000;
            auVar107._20_4_ = 0x4b000000;
            auVar107._24_4_ = 0x4b000000;
            auVar107._28_4_ = 0x4b000000;
            auVar108 = vpblendw_avx2(auVar20,auVar107,0xaa);
            auVar124._8_4_ = 0x53000000;
            auVar124._0_8_ = 0x5300000053000000;
            auVar124._12_4_ = 0x53000000;
            auVar124._16_4_ = 0x53000000;
            auVar124._20_4_ = 0x53000000;
            auVar124._24_4_ = 0x53000000;
            auVar124._28_4_ = 0x53000000;
            auVar134 = vpsrld_avx2(auVar20,0x10);
            auVar134 = vpblendw_avx2(auVar134,auVar124,0xaa);
            auVar134 = vsubps_avx(auVar134,auVar100);
            fVar122 = auVar134._28_4_ + auVar108._28_4_;
            auVar150 = vpblendw_avx2(auVar19,auVar107,0xaa);
            auVar143 = vpsrld_avx2(auVar19,0x10);
            auVar143 = vpblendw_avx2(auVar143,auVar124,0xaa);
            auVar143 = vsubps_avx(auVar143,auVar100);
            fVar142 = auVar150._28_4_ + auVar143._28_4_;
            auVar115 = vpblendw_avx2(auVar92,auVar107,0xaa);
            auVar148 = vpsrld_avx2(auVar92,0x10);
            auVar148 = vpblendw_avx2(auVar148,auVar124,0xaa);
            auVar148 = vsubps_avx(auVar148,auVar100);
            auVar18 = vpblendw_avx2(auVar21,auVar107,0xaa);
            auVar149 = vpsrld_avx2(auVar21,0x10);
            auVar149 = vpblendw_avx2(auVar149,auVar124,0xaa);
            auVar149 = vsubps_avx(auVar149,auVar100);
            fVar75 = auVar149._28_4_;
            fVar112 = auVar18._28_4_ + fVar75;
            fVar105 = fVar93 * (auVar18._0_4_ + auVar149._0_4_);
            fVar109 = fVar93 * (auVar18._4_4_ + auVar149._4_4_);
            auVar23._4_4_ = fVar109;
            auVar23._0_4_ = fVar105;
            fVar110 = fVar93 * (auVar18._8_4_ + auVar149._8_4_);
            auVar23._8_4_ = fVar110;
            fVar95 = fVar93 * (auVar18._12_4_ + auVar149._12_4_);
            auVar23._12_4_ = fVar95;
            fVar94 = fVar93 * (auVar18._16_4_ + auVar149._16_4_);
            auVar23._16_4_ = fVar94;
            fVar104 = fVar93 * (auVar18._20_4_ + auVar149._20_4_);
            auVar23._20_4_ = fVar104;
            fVar111 = fVar93 * (auVar18._24_4_ + auVar149._24_4_);
            auVar23._24_4_ = fVar111;
            auVar23._28_4_ = fVar112;
            fVar123 = (auVar115._0_4_ + auVar148._0_4_) * fVar93;
            fVar126 = (auVar115._4_4_ + auVar148._4_4_) * fVar93;
            auVar18._4_4_ = fVar126;
            auVar18._0_4_ = fVar123;
            fVar127 = (auVar115._8_4_ + auVar148._8_4_) * fVar93;
            auVar18._8_4_ = fVar127;
            fVar128 = (auVar115._12_4_ + auVar148._12_4_) * fVar93;
            auVar18._12_4_ = fVar128;
            fVar129 = (auVar115._16_4_ + auVar148._16_4_) * fVar93;
            auVar18._16_4_ = fVar129;
            fVar130 = (auVar115._20_4_ + auVar148._20_4_) * fVar93;
            auVar18._20_4_ = fVar130;
            fVar131 = (auVar115._24_4_ + auVar148._24_4_) * fVar93;
            auVar18._24_4_ = fVar131;
            auVar18._28_4_ = fVar75;
            fVar132 = (auVar150._0_4_ + auVar143._0_4_) * fVar93;
            fVar136 = (auVar150._4_4_ + auVar143._4_4_) * fVar93;
            auVar149._4_4_ = fVar136;
            auVar149._0_4_ = fVar132;
            fVar137 = (auVar150._8_4_ + auVar143._8_4_) * fVar93;
            auVar149._8_4_ = fVar137;
            fVar138 = (auVar150._12_4_ + auVar143._12_4_) * fVar93;
            auVar149._12_4_ = fVar138;
            fVar139 = (auVar150._16_4_ + auVar143._16_4_) * fVar93;
            auVar149._16_4_ = fVar139;
            fVar140 = (auVar150._20_4_ + auVar143._20_4_) * fVar93;
            auVar149._20_4_ = fVar140;
            fVar141 = (auVar150._24_4_ + auVar143._24_4_) * fVar93;
            auVar149._24_4_ = fVar141;
            auVar149._28_4_ = fVar142;
            fVar113 = fVar93 * (auVar134._0_4_ + auVar108._0_4_);
            fVar116 = fVar93 * (auVar134._4_4_ + auVar108._4_4_);
            auVar148._4_4_ = fVar116;
            auVar148._0_4_ = fVar113;
            fVar117 = fVar93 * (auVar134._8_4_ + auVar108._8_4_);
            auVar148._8_4_ = fVar117;
            fVar118 = fVar93 * (auVar134._12_4_ + auVar108._12_4_);
            auVar148._12_4_ = fVar118;
            fVar119 = fVar93 * (auVar134._16_4_ + auVar108._16_4_);
            auVar148._16_4_ = fVar119;
            fVar120 = fVar93 * (auVar134._20_4_ + auVar108._20_4_);
            auVar148._20_4_ = fVar120;
            fVar121 = fVar93 * (auVar134._24_4_ + auVar108._24_4_);
            auVar148._24_4_ = fVar121;
            auVar148._28_4_ = fVar122;
            auVar144._0_4_ = (int)fVar113;
            auVar144._4_4_ = (int)fVar116;
            auVar144._8_4_ = (int)fVar117;
            auVar144._12_4_ = (int)fVar118;
            auVar144._16_4_ = (int)fVar119;
            auVar144._20_4_ = (int)fVar120;
            auVar144._24_4_ = (int)fVar121;
            auVar144._28_4_ = (int)fVar122;
            auVar143 = vpsrad_avx2(auVar144,0x1f);
            auVar134 = vsubps_avx(auVar148,auVar152);
            auVar115._0_4_ = (int)auVar134._0_4_;
            auVar115._4_4_ = (int)auVar134._4_4_;
            auVar115._8_4_ = (int)auVar134._8_4_;
            auVar115._12_4_ = (int)auVar134._12_4_;
            auVar115._16_4_ = (int)auVar134._16_4_;
            auVar115._20_4_ = (int)auVar134._20_4_;
            auVar115._24_4_ = (int)auVar134._24_4_;
            auVar115._28_4_ = (int)auVar134._28_4_;
            auVar134 = vpand_avx2(auVar143,auVar115);
            auVar148 = vpor_avx2(auVar144,auVar134);
            auVar145._0_4_ = (int)fVar132;
            auVar145._4_4_ = (int)fVar136;
            auVar145._8_4_ = (int)fVar137;
            auVar145._12_4_ = (int)fVar138;
            auVar145._16_4_ = (int)fVar139;
            auVar145._20_4_ = (int)fVar140;
            auVar145._24_4_ = (int)fVar141;
            auVar145._28_4_ = (int)fVar142;
            auVar143 = vpsrad_avx2(auVar145,0x1f);
            auVar134 = vsubps_avx(auVar149,auVar152);
            auVar135._0_4_ = (int)auVar134._0_4_;
            auVar135._4_4_ = (int)auVar134._4_4_;
            auVar135._8_4_ = (int)auVar134._8_4_;
            auVar135._12_4_ = (int)auVar134._12_4_;
            auVar135._16_4_ = (int)auVar134._16_4_;
            auVar135._20_4_ = (int)auVar134._20_4_;
            auVar135._24_4_ = (int)auVar134._24_4_;
            auVar135._28_4_ = (int)auVar134._28_4_;
            auVar134 = vpand_avx2(auVar135,auVar143);
            auVar149 = vpor_avx2(auVar145,auVar134);
            in_ZMM8 = ZEXT3264(auVar149);
            auVar146._0_4_ = (int)fVar123;
            auVar146._4_4_ = (int)fVar126;
            auVar146._8_4_ = (int)fVar127;
            auVar146._12_4_ = (int)fVar128;
            auVar146._16_4_ = (int)fVar129;
            auVar146._20_4_ = (int)fVar130;
            auVar146._24_4_ = (int)fVar131;
            auVar146._28_4_ = (int)fVar75;
            auVar143 = vpsrad_avx2(auVar146,0x1f);
            auVar134 = vsubps_avx(auVar18,auVar152);
            auVar125._0_4_ = (int)auVar134._0_4_;
            auVar125._4_4_ = (int)auVar134._4_4_;
            auVar125._8_4_ = (int)auVar134._8_4_;
            auVar125._12_4_ = (int)auVar134._12_4_;
            auVar125._16_4_ = (int)auVar134._16_4_;
            auVar125._20_4_ = (int)auVar134._20_4_;
            auVar125._24_4_ = (int)auVar134._24_4_;
            auVar125._28_4_ = (int)auVar134._28_4_;
            auVar134 = vpand_avx2(auVar143,auVar125);
            auVar143 = vpor_avx2(auVar146,auVar134);
            auVar147._0_4_ = (int)fVar105;
            auVar147._4_4_ = (int)fVar109;
            auVar147._8_4_ = (int)fVar110;
            auVar147._12_4_ = (int)fVar95;
            auVar147._16_4_ = (int)fVar94;
            auVar147._20_4_ = (int)fVar104;
            auVar147._24_4_ = (int)fVar111;
            auVar147._28_4_ = (int)fVar112;
            auVar150 = vpsrad_avx2(auVar147,0x1f);
            auVar134 = vsubps_avx(auVar23,auVar152);
            auVar108._0_4_ = (int)auVar134._0_4_;
            auVar108._4_4_ = (int)auVar134._4_4_;
            auVar108._8_4_ = (int)auVar134._8_4_;
            auVar108._12_4_ = (int)auVar134._12_4_;
            auVar108._16_4_ = (int)auVar134._16_4_;
            auVar108._20_4_ = (int)auVar134._20_4_;
            auVar108._24_4_ = (int)auVar134._24_4_;
            auVar108._28_4_ = (int)auVar134._28_4_;
            auVar134 = vpand_avx2(auVar150,auVar108);
            auVar151._8_4_ = 0xff;
            auVar151._0_8_ = 0xff000000ff;
            auVar151._12_4_ = 0xff;
            auVar151._16_4_ = 0xff;
            auVar151._20_4_ = 0xff;
            auVar151._24_4_ = 0xff;
            auVar151._28_4_ = 0xff;
            auVar134 = vpor_avx2(auVar147,auVar134);
            auVar134 = vpminud_avx2(auVar134,auVar151);
            auVar143 = vpminud_avx2(auVar143,auVar151);
            auVar134 = vpackusdw_avx2(auVar134,auVar143);
            auVar143 = vpminud_avx2(auVar149,auVar151);
            auVar148 = vpminud_avx2(auVar148,auVar151);
            auVar143 = vpackusdw_avx2(auVar143,auVar148);
            auVar143 = vpermq_avx2(auVar143,0xd8);
            auVar134 = vpermq_avx2(auVar134,0xd8);
            auVar134 = vpackuswb_avx2(auVar143,auVar134);
            auVar134 = vpermq_avx2(auVar134,0xd8);
            *(undefined1 (*) [32])((long)&asStack_298[0].data + lVar64) = auVar134;
            lVar64 = lVar64 + 0x20;
            auVar150._8_4_ = 0x20;
            auVar150._0_8_ = 0x2000000020;
            auVar150._12_4_ = 0x20;
            auVar150._16_4_ = 0x20;
            auVar150._20_4_ = 0x20;
            auVar150._24_4_ = 0x20;
            auVar150._28_4_ = 0x20;
            auVar19 = vpaddd_avx2(auVar19,auVar150);
            auVar20 = vpaddd_avx2(auVar20,auVar150);
            auVar21 = vpaddd_avx2(auVar21,auVar150);
            auVar92 = vpaddd_avx2(auVar92,auVar150);
          } while (lVar64 != 0x100);
          if (0 < psVar71[1].cff.cursor) {
            lVar51._0_4_ = psVar71[1].hmtx;
            lVar51._4_4_ = psVar71[1].kern;
            iVar38 = 0;
            do {
              if ((*(int *)(lVar51 + 0xc) != 0) &&
                 (puVar52 = (uint *)(ulong)*(ushort *)(lVar51 + 6), *(ushort *)(lVar51 + 6) != 0)) {
                uVar30 = *(ushort *)(lVar51 + 4);
                iVar68 = pIVar73->TexWidth;
                puVar44 = pIVar73->TexPixelsAlpha8 +
                          (ulong)*(ushort *)(lVar51 + 10) * (long)iVar68 +
                          (ulong)*(ushort *)(lVar51 + 8);
                do {
                  if ((ulong)uVar30 != 0) {
                    uVar40 = 0;
                    do {
                      puVar44[uVar40] =
                           *(uchar *)((long)&asStack_298[0].data + (ulong)puVar44[uVar40]);
                      uVar40 = uVar40 + 1;
                    } while (uVar30 != uVar40);
                  }
                  iVar39 = (int)puVar52;
                  puVar52 = (uint *)(ulong)(iVar39 - 1);
                  puVar44 = puVar44 + iVar68;
                } while (1 < iVar39);
              }
              iVar38 = iVar38 + 1;
              lVar51 = lVar51 + 0x10;
            } while (iVar38 < psVar71[1].cff.cursor);
          }
        }
        psVar71[1].hmtx = 0;
        psVar71[1].kern = 0;
      }
      lVar64 = lStack_3d0 + 1;
    } while (lVar64 != CONCAT44(iVar155,uVar154));
  }
  ImGui::MemFree(psStack_420);
  ImGui::MemFree(psStack_358);
  uVar5 = auStack_4a8._8_8_;
  if ((void *)auStack_4a8._8_8_ != (void *)0x0) {
    auVar26._8_8_ = 0;
    auVar26._0_8_ = auStack_4a8._8_8_;
    auStack_4a8 = auVar26 << 0x40;
    ImGui::MemFree((void *)uVar5);
    auStack_4a8._8_8_ = 0;
  }
  lVar69 = CONCAT44(iVar155,uVar154);
  if (0 < (int)uVar154) {
    lVar64 = 0;
    uStack_498._0_2_ = 1;
    uStack_498._2_2_ = 1;
    uStack_494 = 1;
    uStack_492 = 1;
    uStack_490 = 1;
    uStack_48e = 1;
    uStack_48c = 1;
    uStack_48a = 1;
    pvVar43 = __s;
    do {
      fVar93 = (float)CONCAT22(uStack_498._2_2_,(undefined2)uStack_498);
      lVar69 = lVar64 * 0x110;
      __s = pvVar43;
      if (*(int *)((long)pvVar43 + lVar69 + 0xe8) != 0) {
        if ((pIStack_4b8->ConfigData).Size <= lVar64) goto LAB_00190e4b;
        pIVar15 = (pIStack_4b8->ConfigData).Data;
        pIVar66 = pIVar15 + lVar64;
        pIVar12 = pIVar15[lVar64].DstFont;
        if (pIVar15[lVar64].MergeMode == false) {
          fVar93 = pIVar15[lVar64].SizePixels;
          lVar51 = *(long *)((long)pvVar43 + lVar69 + 8);
          lVar55 = (long)*(int *)((long)pvVar43 + lVar69 + 0x24);
          auStack_488 = vpinsrb_avx(ZEXT116(*(byte *)(lVar51 + 4 + lVar55)),
                                    (uint)*(byte *)(lVar51 + 6 + lVar55),1);
          auStack_468 = vpinsrb_avx(ZEXT116(*(byte *)(lVar51 + 5 + lVar55)),
                                    (uint)*(byte *)(lVar51 + 7 + lVar55),1);
          ImFont::ClearOutputData(pIVar12);
          auVar114 = vpunpcklbw_avx(auStack_468,auStack_488);
          uVar54 = vpextrw_avx(auVar114,1);
          fVar93 = fVar93 / (float)((int)auVar114._0_2_ - (int)(short)uVar54);
          auVar84 = vpmovsxwd_avx(auVar114);
          auVar24._2_2_ = uStack_498._2_2_;
          auVar24._0_2_ = (undefined2)uStack_498;
          auVar24._4_2_ = uStack_494;
          auVar24._6_2_ = uStack_492;
          auVar24._8_2_ = uStack_490;
          auVar24._10_2_ = uStack_48e;
          auVar24._12_2_ = uStack_48c;
          auVar24._14_2_ = uStack_48a;
          auVar114 = vpcmpgtw_avx(auVar24,auVar114);
          auVar114 = vpmovsxwd_avx(auVar114);
          auVar99._8_4_ = 0x3f800000;
          auVar99._0_8_ = 0x3f8000003f800000;
          auVar99._12_4_ = 0x3f800000;
          auVar103._8_4_ = 0xbf800000;
          auVar103._0_8_ = 0xbf800000bf800000;
          auVar103._12_4_ = 0xbf800000;
          auVar114 = vblendvps_avx(auVar99,auVar103,auVar114);
          auVar84 = vcvtdq2ps_avx(auVar84);
          auVar86._0_4_ = (int)(auVar84._0_4_ * fVar93 + auVar114._0_4_);
          auVar86._4_4_ = (int)(auVar84._4_4_ * fVar93 + auVar114._4_4_);
          auVar86._8_4_ = (int)(auVar84._8_4_ * fVar93 + auVar114._8_4_);
          auVar86._12_4_ = (int)(auVar84._12_4_ * fVar93 + auVar114._12_4_);
          auVar114 = vcvtdq2ps_avx(auVar86);
          pIVar12->FontSize = pIVar66->SizePixels;
          pIVar12->ConfigData = pIVar66;
          pIVar12->ConfigDataCount = 0;
          pIVar12->ContainerAtlas = pIStack_4b8;
          uVar5 = vmovlps_avx(auVar114);
          pIVar12->Ascent = (float)(int)uVar5;
          pIVar12->Descent = (float)(int)((ulong)uVar5 >> 0x20);
        }
        pIVar12->ConfigDataCount = pIVar12->ConfigDataCount + 1;
        if (0 < *(int *)((long)pvVar43 + lVar69 + 0xe8)) {
          fVar93 = (pIVar66->GlyphOffset).x;
          auVar114 = vcvtdq2ps_avx(ZEXT416((uint)(int)(pIVar12->Ascent + 0.5)));
          auStack_488._0_4_ = auVar114._0_4_ + (pIVar66->GlyphOffset).y;
          lVar55 = 0;
          lVar51 = 0;
          do {
            if (*(int *)((long)pvVar43 + lVar69 + 0x100) <= lVar51) goto LAB_00190dcc;
            lVar16 = *(long *)((long)pvVar43 + lVar69 + 0xd0);
            fVar75 = 1.0 / (float)pIStack_4b8->TexWidth;
            fVar105 = 1.0 / (float)pIStack_4b8->TexHeight;
            ImFont::AddGlyph(pIVar12,pIVar66,
                             *(ImWchar *)(*(long *)((long)pvVar43 + lVar69 + 0x108) + lVar51 * 4),
                             fVar93 + *(float *)(lVar16 + 8 + lVar55) + 0.0,
                             (float)auStack_488._0_4_ + *(float *)(lVar16 + 0xc + lVar55) + 0.0,
                             fVar93 + *(float *)(lVar16 + 0x14 + lVar55) + 0.0,
                             (float)auStack_488._0_4_ + *(float *)(lVar16 + 0x18 + lVar55) + 0.0,
                             fVar75 * (float)*(ushort *)(lVar16 + lVar55),
                             fVar105 * (float)*(ushort *)(lVar16 + 2 + lVar55),
                             fVar75 * (float)*(ushort *)(lVar16 + 4 + lVar55),
                             fVar105 * (float)*(ushort *)(lVar16 + 6 + lVar55),
                             *(float *)(lVar16 + 0x10 + lVar55));
            lVar51 = lVar51 + 1;
            lVar55 = lVar55 + 0x1c;
          } while (lVar51 < *(int *)((long)pvVar43 + lVar69 + 0xe8));
        }
      }
      lVar64 = lVar64 + 1;
      lVar69 = CONCAT44(iVar155,uVar154);
      pvVar43 = __s;
    } while (lVar64 != lVar69);
  }
  sVar28 = sStack_300;
  pIVar73 = pIStack_4b8;
  if (0 < (int)lVar69) {
    sVar59 = 0;
    do {
      pvVar43 = *(void **)((long)__s + sVar59 + 0x108);
      if (pvVar43 != (void *)0x0) {
        ImGui::MemFree(pvVar43);
      }
      pvVar43 = *(void **)((long)__s + sVar59 + 0xf8);
      if (pvVar43 != (void *)0x0) {
        ImGui::MemFree(pvVar43);
      }
      sVar59 = sVar59 + 0x110;
    } while (sVar28 != sVar59);
  }
  ImFontAtlasBuildFinish(pIVar73);
  if (pvStack_430 != (void *)0x0) {
    ImGui::MemFree(pvStack_430);
  }
  if ((void *)auStack_4a8._8_8_ != (void *)0x0) {
    ImGui::MemFree((void *)auStack_4a8._8_8_);
  }
LAB_00190cba:
  if (pvStack_450 != (void *)0x0) {
    ImGui::MemFree(pvStack_450);
  }
  if (__s != (void *)0x0) {
    ImGui::MemFree(__s);
  }
  return bStack_4e1;
LAB_00190e65:
  fVar93 = (float)CONCAT22(uStack_498._2_2_,(undefined2)uStack_498);
  __function = "T &ImVector<ImFontBuildDstData>::operator[](int) [T = ImFontBuildDstData]";
  goto LAB_00190de1;
LAB_00190e4b:
  __function = "T &ImVector<ImFontConfig>::operator[](int) [T = ImFontConfig]";
  goto LAB_00190de1;
LAB_00190dcc:
  __function = "T &ImVector<int>::operator[](int) [T = int]";
  fVar93 = uStack_498;
LAB_00190de1:
  uStack_498 = fVar93;
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                ,0x66a,__function);
}

Assistant:

bool    ImFontAtlas::Build()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");

    // Select builder
    // - Note that we do not reassign to atlas->FontBuilderIO, since it is likely to point to static data which
    //   may mess with some hot-reloading schemes. If you need to assign to this (for dynamic selection) AND are
    //   using a hot-reloading scheme that messes up static data, store your own instance of ImFontBuilderIO somewhere
    //   and point to it instead of pointing directly to return value of the GetBuilderXXX functions.
    const ImFontBuilderIO* builder_io = FontBuilderIO;
    if (builder_io == NULL)
    {
#ifdef IMGUI_ENABLE_FREETYPE
        builder_io = ImGuiFreeType::GetBuilderForFreeType();
#elif defined(IMGUI_ENABLE_STB_TRUETYPE)
        builder_io = ImFontAtlasGetBuilderForStbTruetype();
#else
        IM_ASSERT(0); // Invalid Build function
#endif
    }

    // Build
    return builder_io->FontBuilder_Build(this);
}